

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_av1d_vdpu.c
# Opt level: O3

MPP_RET vdpu_av1d_gen_regs(void *hal,HalTaskInfo *task)

{
  HalBufs *bufs;
  uint *puVar1;
  short *psVar2;
  short *psVar3;
  undefined8 uVar4;
  char cVar5;
  ushort uVar6;
  ushort uVar7;
  int *piVar8;
  void *pvVar9;
  MppBufferGroup group;
  bool bVar10;
  RK_S32 m;
  uint uVar11;
  RK_S32 max_cnt;
  MPP_RET MVar12;
  MppFrameFormat MVar13;
  int *piVar14;
  size_t sVar15;
  undefined2 *puVar16;
  char *pcVar17;
  char *pcVar18;
  HalBuf *pHVar19;
  void *pvVar20;
  int *piVar21;
  sbyte sVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  long lVar34;
  long lVar35;
  undefined1 *puVar36;
  uint *puVar37;
  long lVar38;
  uint uVar39;
  uint *puVar40;
  byte bVar41;
  byte bVar42;
  uint uVar43;
  int iVar44;
  int iVar45;
  RK_U32 RVar46;
  long lVar47;
  uint *puVar48;
  RK_S32 downscaledLumaPlaneW;
  int iVar49;
  ulong uVar50;
  int iVar51;
  VdpuAv1dRegCtx *reg_ctx;
  undefined1 *puVar52;
  int iVar53;
  VdpuAv1dRegCtx *reg_ctx_1;
  ulong uVar54;
  undefined2 *puVar55;
  ulong uVar56;
  bool bVar57;
  ulong uVar58;
  undefined1 auVar59 [16];
  ulong uVar60;
  ulong uVar61;
  undefined1 auVar62 [16];
  byte bVar63;
  undefined1 uVar71;
  byte bVar72;
  undefined1 uVar74;
  byte bVar75;
  undefined1 uVar77;
  byte bVar78;
  undefined1 uVar80;
  undefined1 uVar81;
  undefined1 uVar82;
  ulong uVar64;
  byte bVar83;
  byte bVar84;
  byte bVar85;
  byte bVar86;
  byte bVar87;
  byte bVar88;
  byte bVar89;
  undefined1 auVar65 [16];
  undefined4 uVar94;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 in_XMM6 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  MppBuffer buffer;
  MppFrame mframe;
  RK_U32 local_937c;
  RK_U32 local_9378;
  uint local_9374;
  ulong local_9370;
  MppBuffer streambuf;
  long local_9360;
  HalBuf *local_9358;
  void *local_9350;
  RK_U8 mf_types [3];
  RK_S32 refs_selected [3];
  RK_S32 ar_coeffs_y [24];
  RK_S32 ref_count [24];
  byte local_91a8;
  uint local_91a4;
  uint local_91a0;
  uint local_919c;
  uint local_9198;
  uint local_9194;
  uint local_9190;
  uint local_918c;
  byte local_9188;
  uint local_9184;
  uint local_9180;
  uint local_917c;
  uint local_9178;
  uint local_9174;
  uint local_9170;
  uint local_916c;
  byte local_9168;
  uint local_9164;
  uint local_9160;
  uint local_915c;
  uint local_9158;
  uint local_9154;
  uint local_9150;
  uint local_914c;
  byte local_9148;
  uint local_9144;
  uint local_9140;
  uint local_913c;
  uint local_9138;
  uint local_9134;
  uint local_9130;
  uint local_912c;
  byte local_9128;
  uint local_9124;
  uint local_9120;
  uint local_911c;
  uint local_9118;
  uint local_9114;
  uint local_9110;
  uint local_910c;
  uint auStack_9108 [683];
  undefined1 local_865c [20964];
  RK_S32 cur_offset [7];
  undefined1 local_3040 [5608];
  undefined1 local_1a58 [16];
  uint uStack_1a48;
  uint uStack_1a44;
  uint uStack_1a40;
  undefined1 local_1620 [5616];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  byte bVar73;
  byte bVar76;
  byte bVar79;
  
  piVar8 = *(int **)((long)hal + 0x50);
  pvVar9 = (task->dec).syntax.data;
  buffer = (MppBuffer)0x0;
  streambuf = (MppBuffer)0x0;
  uVar33 = (uint)*(ushort *)((long)pvVar9 + 4);
  local_9370 = (ulong)*(ushort *)((long)pvVar9 + 2);
  uVar39 = 1 << (*(byte *)((long)pvVar9 + 0xc98) & 0x1f);
  piVar8[0x6d19] = (uint)*(byte *)((long)pvVar9 + 0xc86);
  uVar54 = *(ulong *)((long)task + 8);
  if ((uVar54 & 0xc) != 0) {
    _mpp_log_l(2,"hal_av1d_vdpu","parse err %d ref err %d\n","vdpu_av1d_gen_regs",
               (ulong)((uint)(uVar54 >> 2) & 1),(ulong)((uint)uVar54 >> 3 & 1));
    return MPP_OK;
  }
  if (*(int *)((long)hal + 0x58) != 0) {
    lVar34 = 0;
    piVar14 = piVar8;
    do {
      if (*piVar14 == 0) {
        (task->dec).reg_index = (RK_S32)lVar34;
        *(undefined8 *)(piVar8 + 0x79ea) = *(undefined8 *)(piVar14 + 2);
        *piVar14 = 1;
        break;
      }
      lVar34 = lVar34 + 1;
      piVar14 = piVar14 + 4;
    } while (lVar34 != 3);
  }
  pvVar20 = *(void **)(piVar8 + 0x79ea);
  memset(pvVar20,0,0x800);
  lVar34 = *(long *)((long)hal + 0x50);
  uVar11 = (uint)*(ushort *)((long)pvVar9 + 0xe) * (uint)*(ushort *)((long)pvVar9 + 6) + 0x7f >> 3 &
           0xffffff0;
  uVar23 = (*(ushort *)((long)pvVar9 + 8) + 0xf & 0xfffffff0) * uVar11;
  uVar54 = (ulong)((uVar23 >> 1) +
                   ((*(ushort *)((long)pvVar9 + 6) + 0x3f >> 6) * 0x300 + 0x300) *
                   ((*(ushort *)((long)pvVar9 + 8) + 0x3f >> 6) + 1) + uVar23 + 0x200);
  if (*(ulong *)(lVar34 + 0x1e7c0) < uVar54) {
    *(uint *)(lVar34 + 0x1b470) = uVar11;
    *(uint *)(lVar34 + 0x1b478) = uVar23;
    *(uint *)(lVar34 + 0x1b47c) = uVar23 >> 1;
    *(ulong *)(lVar34 + 0x1e7c0) = uVar54;
    bufs = (HalBufs *)(lVar34 + 0x1e7b0);
    if (*(HalBufs *)(lVar34 + 0x1e7b0) != (HalBufs)0x0) {
      hal_bufs_deinit(*(HalBufs *)(lVar34 + 0x1e7b0));
      *bufs = (HalBufs)0x0;
    }
    hal_bufs_init(bufs);
    if (*bufs == (HalBufs)0x0) {
      _mpp_log_l(2,"hal_av1d_vdpu","tile out bufs init fail\n","vdpu_av1d_setup_tile_bufs");
    }
    else {
      max_cnt = mpp_buf_slot_get_count(*(MppBufSlots *)((long)hal + 0x20));
      *(RK_S32 *)(lVar34 + 0x1e7b8) = max_cnt;
      hal_bufs_setup(*(HalBufs *)(lVar34 + 0x1e7b0),max_cnt,1,(size_t *)(lVar34 + 0x1e7c0));
    }
  }
  if (*(VdpuAv1dRegCtx **)(piVar8 + 0x16) == (VdpuAv1dRegCtx *)0x0) {
LAB_0021641c:
    group = *(MppBufferGroup *)((long)hal + 0x38);
    bVar41 = *(byte *)((long)pvVar9 + 0xc98);
    uVar11 = *(ushort *)((long)pvVar9 + 4) + 0x3f;
    uVar23 = uVar11 & 0xffffffc0;
    uVar11 = uVar11 >> 6;
    piVar8[0x1b] = 0;
    uVar43 = uVar23 * 0xf + 0x7f & 0x3fff80;
    piVar8[0x1a] = uVar43;
    iVar44 = uVar43 + uVar23 * 8;
    piVar8[0x1d] = uVar43 << (bVar41 & 0x1f);
    piVar8[0x1c] = uVar23 << 3;
    piVar8[0x1f] = iVar44 << (bVar41 & 0x1f);
    uVar43 = uVar11 * 0x370 + 0x7f & 0xffffff80;
    piVar8[0x1e] = uVar43;
    iVar44 = uVar43 + iVar44;
    piVar8[0x21] = iVar44 << (bVar41 & 0x1f);
    uVar11 = uVar11 * 0x10e0 + 0x7f & 0xffffff80;
    piVar8[0x20] = uVar11;
    iVar44 = uVar11 + iVar44;
    iVar45 = (uVar23 + 0x47 >> 6) * 0x780;
    piVar8[0x23] = iVar44 << (bVar41 & 0x1f);
    piVar8[0x22] = iVar45;
    MVar12 = mpp_buffer_get_with_tag
                       (group,(MppBuffer *)(piVar8 + 0x16),
                        (ulong)((iVar44 + iVar45 << (bVar41 & 0x1f)) + 0xfffU & 0xfffff000),
                        "hal_av1d_vdpu","vdpu_av1d_filtermem_alloc");
    if (MVar12 != MPP_OK) {
      _mpp_log_l(2,"hal_av1d_vdpu","filt buffer get fail\n",(char *)0x0);
      vdpu_av1d_filtermem_release(*(VdpuAv1dRegCtx **)(piVar8 + 0x16));
    }
  }
  else if (((uint)piVar8[0x6d1b] < uVar33) || ((uint)piVar8[0x79f2] < uVar39)) {
    vdpu_av1d_filtermem_release(*(VdpuAv1dRegCtx **)(piVar8 + 0x16));
    goto LAB_0021641c;
  }
  piVar8[0x6d1a] = (int)local_9370;
  piVar8[0x6d1b] = uVar33;
  piVar8[0x79f2] = uVar39;
  mpp_buf_slot_get_prop
            (*(MppBufSlots *)((long)hal + 0x20),(task->dec).output,SLOT_FRAME_PTR,&mframe);
  mpp_buf_slot_get_prop(*(MppBufSlots *)((long)hal + 0x20),(task->dec).output,SLOT_BUFFER,&buffer);
  mpp_buf_slot_get_prop(*(MppBufSlots *)((long)hal + 0x28),(task->dec).input,SLOT_BUFFER,&streambuf)
  ;
  local_9358 = hal_bufs_get_buf(*(HalBufs *)(piVar8 + 0x79ec),(task->dec).output);
  local_9378 = mpp_frame_get_hor_stride(mframe);
  local_937c = mpp_frame_get_ver_stride(mframe);
  piVar8[0x6d1d] = local_937c;
  sVar15 = mpp_packet_get_length((task->dec).input_packet);
  *(int *)((long)hal + 0x10) = (int)sVar15;
  MVar13 = mpp_frame_get_fmt(mframe);
  *(bool *)((long)piVar8 + 0x1e781) = (MVar13 & 0xf00000) != MPP_FMT_YUV420SP;
  if (((byte)hal_av1d_debug & 8) != 0) {
    uVar6 = *(ushort *)((long)pvVar9 + 0xe);
    MVar13 = mpp_frame_get_fmt(mframe);
    _mpp_log_l(4,"hal_av1d_vdpu","bitdepth %d fmt %d [%d : %d] wxh [%d : %d] uxv [%d : %d]\n",
               (char *)0x0,(ulong)uVar6,(ulong)MVar13,(ulong)*(byte *)((long)pvVar9 + 0x52b),
               (ulong)*(byte *)((long)pvVar9 + 0x52c),(ulong)(uint)piVar8[0x6d1a],
               (ulong)(uint)piVar8[0x6d1b],(ulong)(uint)piVar8[0x6d1c],(ulong)(uint)piVar8[0x6d1d]);
  }
  *(uint *)((long)pvVar20 + 4) = (*(uint *)((long)pvVar20 + 4) & 0xffffff5e) + 1;
  *(byte *)((long)pvVar20 + 9) = *(byte *)((long)pvVar20 + 9) | 4;
  uVar39 = *(uint *)((long)pvVar20 + 0xc);
  *(uint *)((long)pvVar20 + 0xc) = uVar39 & 0x7ffffff | 0x88000000;
  *(uint *)((long)pvVar20 + 0xc) =
       (uVar39 & 0x3feeeff | 0x88000000) +
       ((uint)(*(ulong *)((long)pvVar9 + 0x14) >> 6) & 0x4000000) + 0x1100;
  uVar39 = *(uint *)((long)pvVar20 + 0x14);
  uVar11 = (uint)(*(ulong *)((long)pvVar9 + 0x14) >> 0x1b) & 0x800;
  *(uint *)((long)pvVar20 + 0x14) = uVar39 & 0xfffff7ff | uVar11;
  uVar23 = (*(byte *)((long)pvVar9 + 0x53b) & 3) << 0x17;
  *(uint *)((long)pvVar20 + 0x14) = uVar39 & 0xfe7ff7ff | uVar11 | uVar23;
  uVar43 = (*(byte *)((long)pvVar9 + 0x539) & 1) << 0x16;
  *(uint *)((long)pvVar20 + 0x14) = uVar39 & 0xfe3ff7ff | uVar11 | uVar23 | uVar43;
  uVar24 = (*(byte *)((long)pvVar9 + 0x53a) & 1) << 0x15;
  *(uint *)((long)pvVar20 + 0x14) = uVar39 & 0xfe1ff7ff | uVar11 | uVar23 | uVar43 | uVar24;
  uVar25 = *(uint *)((long)pvVar9 + 0x14) >> 0xb & 0x80000;
  *(uint *)((long)pvVar20 + 0x14) = uVar39 & 0xfe17f7ff | uVar11 | uVar23 | uVar43 | uVar24 | uVar25
  ;
  uVar39 = (uVar39 & 0xfe13f7ff | uVar11 | uVar23 | uVar43 | uVar24 | uVar25) +
           (*(uint *)((long)pvVar9 + 0x14) & 0x10000) * 4;
  *(uint *)((long)pvVar20 + 0x14) = uVar39;
  uVar11 = (*(byte *)((long)pvVar9 + 0x529) & 1) << 0x10;
  *(uint *)((long)pvVar20 + 0x14) = uVar39 & 0xfffeffff | uVar11;
  uVar23 = *(uint *)((long)pvVar9 + 0x14) >> 0xc & 0x8000;
  *(uint *)((long)pvVar20 + 0x14) = uVar39 & 0xfffe7fff | uVar11 | uVar23;
  uVar43 = 0x4000;
  if ((((*(char *)((long)pvVar9 + 0x559) == '\0') && (*(char *)((long)pvVar9 + 0x558) == '\0')) &&
      (*(char *)((long)pvVar9 + 0x55a) == '\0')) &&
     ((*(char *)((long)pvVar9 + 0x55b) == '\0' && (*(char *)((long)pvVar9 + 0x56a) == '\0')))) {
    uVar43 = (uint)(*(char *)((long)pvVar9 + 0x56b) != '\0') << 0xe;
  }
  *(uint *)((long)pvVar20 + 0x14) = uVar39 & 0xfffe3fff | uVar11 | uVar23 | uVar43;
  uVar24 = *(uint *)((long)pvVar9 + 0x14) >> 2 & 0x2000;
  *(uint *)((long)pvVar20 + 0x14) = uVar39 & 0xfffe1fff | uVar11 | uVar23 | uVar43 | uVar24;
  uVar25 = *(uint *)((long)pvVar9 + 0x14) >> 2 & 0x1000;
  *(uint *)((long)pvVar20 + 0x14) = uVar39 & 0xfffe0fff | uVar11 | uVar23 | uVar43 | uVar24 | uVar25
  ;
  uVar26 = *(uint *)((long)pvVar9 + 0x14) >> 3 & 0x400;
  *(uint *)((long)pvVar20 + 0x14) =
       uVar39 & 0xfffe0bff | uVar11 | uVar23 | uVar43 | uVar24 | uVar25 | uVar26;
  uVar27 = *(uint *)((long)pvVar9 + 0x14) >> 0x13 & 0x200;
  *(uint *)((long)pvVar20 + 0x14) =
       uVar39 & 0xfffe09ff | uVar11 | uVar23 | uVar43 | uVar24 | uVar25 | uVar26 | uVar27;
  uVar28 = *(uint *)((long)pvVar9 + 0x14) >> 10 & 0x100;
  *(uint *)((long)pvVar20 + 0x14) =
       uVar39 & 0xfffe08ff | uVar11 | uVar23 | uVar43 | uVar24 | uVar25 | uVar26 | uVar27 | uVar28;
  uVar29 = *(uint *)((long)pvVar9 + 0x14) >> 10 & 0x80;
  *(uint *)((long)pvVar20 + 0x14) =
       uVar39 & 0xfffe087f | uVar11 | uVar23 | uVar43 | uVar24 | uVar25 | uVar26 | uVar27 | uVar28 |
       uVar29;
  uVar30 = (uint)(*(ulong *)((long)pvVar9 + 0x14) >> 0x1b) & 0x40;
  *(uint *)((long)pvVar20 + 0x14) =
       uVar39 & 0xfffe083f | uVar11 | uVar23 | uVar43 | uVar24 | uVar25 | uVar26 | uVar27 | uVar28 |
       uVar29 | uVar30;
  uVar31 = *(uint *)((long)pvVar9 + 0x14) >> 0xe & 0x20;
  *(uint *)((long)pvVar20 + 0x14) =
       uVar39 & 0xfffe081f | uVar11 | uVar23 | uVar43 | uVar24 | uVar25 | uVar26 | uVar27 | uVar28 |
       uVar29 | uVar30 | uVar31;
  uVar32 = *(uint *)((long)pvVar9 + 0x14) >> 0x15 & 0x10;
  *(uint *)((long)pvVar20 + 0x14) =
       uVar39 & 0xfffe080f | uVar11 | uVar23 | uVar43 | uVar24 | uVar25 | uVar26 | uVar27 | uVar28 |
       uVar29 | uVar30 | uVar31 | uVar32;
  *(uint *)((long)pvVar20 + 0x14) =
       uVar39 & 0xfffe0807 | uVar11 | uVar23 | uVar43 | uVar24 | uVar25 | uVar26 | uVar27 | uVar28 |
       uVar29 | uVar30 | uVar31 | uVar32 | *(uint *)((long)pvVar9 + 0x14) >> 0x11 & 8;
  lVar34 = *(long *)((long)hal + 0x50);
  lVar35 = *(long *)(lVar34 + 0x1e7a8);
  local_9374 = uVar33;
  local_9350 = pvVar20;
  puVar16 = (undefined2 *)
            mpp_buffer_get_ptr_with_caller
                      (*(MppBuffer *)(lVar34 + 0x50),"vdpu_av1d_set_global_model");
  puVar1 = (uint *)((long)pvVar9 + 0x774);
  puVar40 = (uint *)((long)pvVar9 + 0x7a8);
  uVar54 = 0;
  do {
    lVar38 = uVar54 * 0x6c;
    if ((3 < *(byte *)((long)pvVar9 + lVar38 + 0x7a6)) &&
       (_mpp_log_l(2,"hal_av1d_vdpu","Assertion %s failed at %s:%d\n",(char *)0x0,
                   "dxva->frame_refs[ref_frame].wmtype <= 3","vdpu_av1d_set_global_model",0x59d),
       (mpp_debug._3_1_ & 0x10) != 0)) {
      abort();
    }
    lVar47 = 0;
    puVar37 = puVar40;
    puVar16 = puVar16 + 4;
    do {
      puVar55 = puVar16;
      puVar48 = puVar1 + uVar54 * 0x1b + 0x10;
      if (((int)lVar47 != 2) && (puVar48 = puVar1 + uVar54 * 0x1b + 0xf, (int)lVar47 != 3)) {
        puVar48 = puVar37;
      }
      *(uint *)(puVar55 + -4) = *puVar48;
      lVar47 = lVar47 + 1;
      puVar37 = puVar37 + 1;
      puVar16 = puVar55 + 2;
    } while (lVar47 != 6);
    puVar55[-2] = (short)puVar1[uVar54 * 0x1b + 0x19];
    puVar55[-1] = *(undefined2 *)((long)puVar1 + lVar38 + 0x66);
    *puVar55 = (short)puVar1[uVar54 * 0x1b + 0x1a];
    uVar6 = *(ushort *)((long)puVar1 + lVar38 + 0x6a);
    puVar55[1] = uVar6;
    if (((byte)hal_av1d_debug & 8) != 0) {
      _mpp_log_l(4,"hal_av1d_vdpu","ref_frame[%d] alpa %d beta %d gamma %d delta %d\n",(char *)0x0,
                 uVar54 & 0xffffffff,(ulong)(ushort)puVar1[uVar54 * 0x1b + 0x19],
                 (ulong)*(ushort *)((long)puVar1 + lVar38 + 0x66),
                 (ulong)(ushort)puVar1[uVar54 * 0x1b + 0x1a],(ulong)uVar6);
    }
    uVar54 = uVar54 + 1;
    puVar40 = puVar40 + 0x1b;
  } while (uVar54 != 7);
  uVar33 = 0;
  mpp_buffer_sync_end_f(*(MppBuffer *)(lVar34 + 0x50),0,"vdpu_av1d_set_global_model");
  *(undefined4 *)(lVar35 + 0x148) = 0;
  iVar44 = mpp_buffer_get_fd_with_caller(*(MppBuffer *)(lVar34 + 0x50),"vdpu_av1d_set_global_model")
  ;
  *(int *)(lVar35 + 0x14c) = iVar44;
  iVar44 = *(int *)((long)hal + 0x10);
  lVar34 = *(long *)((long)hal + 0x50);
  cVar5 = *(char *)(lVar34 + 0x1e783);
  iVar45 = *(int *)((long)pvVar9 + 0xc7c);
  iVar53 = *(int *)((long)pvVar9 + 0xc80);
  pcVar17 = (char *)mpp_buffer_get_ptr_with_caller
                              (*(MppBuffer *)(lVar34 + 0x40),"vdpu_av1d_set_tile_info_mem");
  uVar39 = (uint)*(ushort *)((long)pvVar9 + (ulong)(cVar5 == '\0') * 2 + 0x1c);
  uVar6 = *(ushort *)((long)pvVar9 + (ulong)(cVar5 != '\0') * 2 + 0x1c);
  uVar7 = *(ushort *)((long)pvVar9 + 0x1c);
  if (uVar7 == 0) {
    uVar54 = 0;
    uVar11 = 0;
  }
  else {
    uVar11 = 0;
    uVar61 = 0;
    do {
      ref_count[uVar61] = uVar11;
      uVar11 = (uint)(byte)((char)uVar11 + *(char *)((long)pvVar9 + uVar61 * 2 + 0x22));
      bVar41 = (char)uVar61 + 1;
      uVar61 = (ulong)bVar41;
      uVar54 = (ulong)bVar41;
    } while (bVar41 < uVar7);
  }
  ref_count[uVar54] = uVar11;
  uVar7 = *(ushort *)((long)pvVar9 + 0x1e);
  if (uVar7 == 0) {
    uVar54 = 0;
  }
  else {
    bVar41 = 0;
    uVar61 = 0;
    do {
      auStack_9108[uVar61] = (uint)bVar41;
      bVar41 = bVar41 + *(char *)((long)pvVar9 + uVar61 * 2 + 0xa2);
      bVar42 = (char)uVar61 + 1;
      uVar61 = (ulong)bVar42;
      uVar54 = (ulong)bVar42;
    } while (bVar42 < uVar7);
    uVar33 = (uint)bVar41;
  }
  auStack_9108[uVar54] = uVar33;
  local_9360 = lVar34;
  if (uVar39 != 0) {
    uVar33 = iVar44 - (iVar45 + iVar53);
    iVar44 = 0;
    uVar11 = 0;
    bVar57 = false;
    do {
      if (uVar6 != 0) {
        uVar54 = 0;
        uVar23 = uVar11;
        do {
          pcVar18 = pcVar17;
          uVar61 = uVar54;
          if (cVar5 == '\0') {
            uVar61 = (ulong)uVar11;
          }
          uVar43 = iVar44 + (int)uVar54;
          uVar50 = uVar54;
          if (cVar5 != '\0') {
            uVar43 = uVar23;
            uVar50 = (ulong)uVar11;
          }
          uVar24 = auStack_9108[uVar61];
          uVar25 = auStack_9108[uVar61 + 1];
          uVar26 = ref_count[uVar50];
          uVar27 = ref_count[uVar50 + 1];
          uVar61 = *(ulong *)((long)pvVar9 + 0x14);
          if (!bVar57) {
            uVar28 = (uint)uVar61 & 0x1000;
            bVar41 = 1;
            if (((int)uVar50 == *(ushort *)((long)pvVar9 + 0x1c) - 1) || ((uVar61 & 0x1000) != 0)) {
LAB_00216c8d:
              bVar42 = 7 - (uVar28 == 0);
            }
            else {
              bVar42 = 6;
              bVar41 = 1;
              if ((uVar27 - uVar26 == 1) &&
                 (((uVar61 & 0x400000000) != 0 && (bVar41 = 0, ((byte)hal_av1d_debug & 8) != 0)))) {
                bVar41 = 0;
                _mpp_log_l(4,"hal_av1d_vdpu","WARNING: Superres used and tile width == 64\n",
                           (char *)0x0);
                uVar61 = *(ulong *)((long)pvVar9 + 0x14);
                uVar28 = (uint)uVar61 & 0x1000;
                goto LAB_00216c8d;
              }
            }
            iVar45 = uVar27 - uVar26 << (bVar42 & 0x1f);
            if ((uVar61 & 0x400000000) == 0) {
              if (0x1000 < iVar45) {
                pcVar17 = "WARNING: Tile width > 4096\n";
                if (((byte)hal_av1d_debug & 8) == 0) goto LAB_00216d37;
LAB_00216cc9:
                bVar41 = 0;
                _mpp_log_l(4,"hal_av1d_vdpu",pcVar17,(char *)0x0);
                uVar61 = *(ulong *)((long)pvVar9 + 0x14);
              }
            }
            else if (0x8003 < (int)((*(ushort *)((long)pvVar9 + 0xc) + 9) * iVar45)) {
              pcVar17 = "WARNING: Tile width after superres > 4096\n";
              if (((byte)hal_av1d_debug & 8) != 0) goto LAB_00216cc9;
LAB_00216d37:
              bVar41 = 0;
            }
            bVar57 = (bool)(bVar41 ^ 1);
          }
          sVar22 = (((uint)uVar61 >> 0xc & 1) != 0) + 6;
          if (((uint)*(ushort *)((long)pvVar9 + 2) <= uVar26 << sVar22) ||
             ((uint)*(ushort *)((long)pvVar9 + 4) <= uVar24 << sVar22)) {
            bVar57 = true;
          }
          *pcVar18 = (char)uVar27 - (char)uVar26;
          pcVar18[1] = '\0';
          pcVar18[2] = '\0';
          pcVar18[3] = '\0';
          pcVar18[4] = (char)uVar25 - (char)uVar24;
          pcVar18[5] = '\0';
          pcVar18[6] = '\0';
          pcVar18[7] = '\0';
          uVar28 = *(uint *)((long)pvVar9 + (ulong)uVar43 * 4 + 0x124);
          bVar10 = uVar33 < uVar28 + 1;
          if (bVar57) {
            bVar10 = bVar57;
          }
          *(uint *)(pcVar18 + 8) = uVar28;
          uVar43 = *(uint *)((long)pvVar9 + (ulong)uVar43 * 4 + 0x324);
          *(uint *)(pcVar18 + 0xc) = uVar43;
          bVar57 = uVar33 < uVar43;
          if (bVar10) {
            bVar57 = bVar10;
          }
          if (((byte)hal_av1d_debug & 8) != 0) {
            _mpp_log_l(4,"hal_av1d_vdpu",
                       "tile_info[%d][%d]: start=%08x end=%08x x0:x1=%d:%d y0:y1=%d:%d\n",
                       (char *)0x0,(ulong)uVar11,uVar54,(ulong)uVar28,(ulong)uVar43,(ulong)uVar26,
                       (ulong)uVar27,(ulong)uVar24,(ulong)uVar25);
          }
          uVar43 = (int)uVar54 + 1;
          uVar54 = (ulong)uVar43;
          uVar23 = uVar23 + uVar39;
          pcVar17 = pcVar18 + 0x10;
        } while (uVar6 != uVar43);
        pcVar17 = pcVar18 + 0x10;
      }
      uVar11 = uVar11 + 1;
      iVar44 = iVar44 + (uint)uVar6;
    } while (uVar11 != uVar39);
  }
  mpp_buffer_sync_end_f(*(MppBuffer *)(local_9360 + 0x40),0,"vdpu_av1d_set_tile_info_mem");
  if ((*(byte *)((long)pvVar9 + 0x528) & 0xfd) == 0) {
    uVar39 = (uint)*(undefined8 *)((long)pvVar9 + 0x14);
    if ((uVar39 >> 0x19 & 1) == 0) goto LAB_002185df;
  }
  else {
    uVar39 = (uint)*(undefined8 *)((long)pvVar9 + 0x14);
  }
  lVar34 = *(long *)(piVar8 + 0x79ea);
  ref_count[0x14] = 0;
  ref_count[0x15] = 0;
  ref_count[0x16] = 0;
  ref_count[0x17] = 0;
  ref_count[0x10] = 0;
  ref_count[0x11] = 0;
  ref_count[0x12] = 0;
  ref_count[0x13] = 0;
  ref_count[0xc] = 0;
  ref_count[0xd] = 0;
  ref_count[0xe] = 0;
  ref_count[0xf] = 0;
  ref_count[8] = 0;
  ref_count[9] = 0;
  ref_count[10] = 0;
  ref_count[0xb] = 0;
  ref_count[4] = 0;
  ref_count[5] = 0;
  ref_count[6] = 0;
  ref_count[7] = 0;
  ref_count[0] = 0;
  ref_count[1] = 0;
  ref_count[2] = 0;
  ref_count[3] = 0;
  RVar46 = piVar8[0x6d1e];
  iVar44 = piVar8[0x6d1f];
  if ((uVar39 >> 0x19 & 1) == 0) {
    lVar35 = 0;
    do {
      lVar38 = (long)*(char *)((long)pvVar9 + lVar35 + 0x7a4);
      if (-1 < lVar38) {
        ref_count[lVar38] = ref_count[lVar38] + 1;
      }
      lVar35 = lVar35 + 0x6c;
    } while (lVar35 != 0x2f4);
    lVar35 = 0;
    do {
      if (ref_count[lVar35] != 0) {
        *(uint *)(lVar34 + 0x10) =
             *(uint *)(lVar34 + 0x10) & 0xfffffff0 | *(uint *)(lVar34 + 0x10) + 1 & 0xf;
      }
      lVar35 = lVar35 + 1;
    } while (lVar35 != 0x18);
  }
  else {
    *(uint *)(lVar34 + 0x10) = (*(uint *)(lVar34 + 0x10) & 0xfffffff0) + 1;
  }
  uVar6 = *(ushort *)((long)pvVar9 + 2);
  uVar7 = *(ushort *)((long)pvVar9 + 4);
  uVar54 = (ulong)uVar7;
  lVar35 = *(long *)((long)hal + 0x50);
  if ((*(char *)((long)pvVar9 + 0x531) == '\0') || ((*(byte *)((long)pvVar9 + 0x528) & 0xfd) == 0))
  {
    *(undefined1 (*) [16])(lVar35 + 0x1e794) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])(lVar35 + 0x1e784) = (undefined1  [16])0x0;
  }
  else {
    lVar38 = 0;
    do {
      if (-1 < *(char *)((long)pvVar9 + lVar38 * 0x6c + 0x7a4)) {
        uVar39 = puVar1[lVar38 * 0x1b + 2];
        bVar41 = *(byte *)((long)pvVar9 + 0x530);
        if (*(char *)((long)pvVar9 + 0x531) == '\0') {
          uVar33 = 0;
        }
        else {
          uVar11 = 1 << (*(char *)((long)pvVar9 + 0x531) - 1U & 0x1f);
          uVar33 = uVar39 - bVar41;
          uVar33 = (uint)((int)(uVar11 & uVar33) < (int)(uVar11 - 1 & uVar33));
        }
        *(uint *)(lVar35 + 0x1e788 + lVar38 * 4) = uVar33;
        if (((byte)hal_av1d_debug & 8) != 0) {
          _mpp_log_l(4,"hal_av1d_vdpu","frame_refs[%d] order_hint %d ref_frame_offset %d\n",
                     (char *)0x0,lVar38,(ulong)bVar41,(ulong)uVar39);
          uVar54 = (ulong)(uint)uVar7;
        }
      }
      lVar38 = lVar38 + 1;
    } while (lVar38 != 7);
  }
  uVar61 = uVar54 >> 1;
  lVar35 = 0;
  bVar57 = false;
  uVar39 = 0;
  puVar40 = puVar1;
  do {
    uVar33 = (uint)uVar54;
    if ((*(byte *)((long)pvVar9 + 0x17) & 2) == 0) {
      uVar33 = puVar40[1];
      bVar41 = (byte)puVar40[0xc];
      if ((char)bVar41 < '\x01') {
        bVar41 = 0;
      }
      uVar23 = (uint)bVar41;
      uVar11 = *puVar40;
    }
    else {
      uVar23 = (uint)*(ushort *)((long)pvVar9 + 10);
      uVar11 = (uint)uVar6;
    }
    *(uint *)(lVar34 + 0x84) = uVar33 & 0xffff | uVar11 << 0x10;
    uVar11 = (uVar11 * 0x4000 + (uint)(uVar6 >> 1)) / (uint)uVar6;
    uVar33 = (uint)((uVar33 * 0x4000 + (int)uVar61) / uVar54);
    *(uint *)(lVar34 + 0x90) = uVar33 & 0xffff | uVar11 << 0x10;
    if (uVar33 != 0x4000 || uVar11 != 0x4000) {
      uVar39 = 1;
    }
    if (uVar23 == (int)(char)piVar8[0x79e0]) {
      bVar57 = true;
    }
    pHVar19 = hal_bufs_get_buf(*(HalBufs *)(piVar8 + 0x79ec),uVar23);
    if (pHVar19 == (HalBuf *)0x0) {
      _mpp_log_l(2,"hal_av1d_vdpu","get slots frame buff fail","set_ref_lum_base");
    }
    else {
      iVar45 = mpp_buffer_get_fd_with_caller(*pHVar19->buf,"set_ref_lum_base");
      *(int *)(lVar34 + 0x10c) = iVar45;
    }
    lVar38 = *(long *)(*(long *)((long)hal + 0x50) + 0x1e7a8);
    pHVar19 = hal_bufs_get_buf(*(HalBufs *)(piVar8 + 0x79ec),uVar23);
    if (pHVar19 == (HalBuf *)0x0) {
      _mpp_log_l(2,"hal_av1d_vdpu","get slots frame buff fail","set_ref_cb_base");
    }
    else {
      iVar45 = mpp_buffer_get_fd_with_caller(*pHVar19->buf,"set_ref_cb_base");
      mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 0x48),0x65,RVar46);
      *(int *)(lVar38 + 0x194) = iVar45;
    }
    lVar38 = *(long *)(*(long *)((long)hal + 0x50) + 0x1e7a8);
    pHVar19 = hal_bufs_get_buf(*(HalBufs *)(piVar8 + 0x79ec),uVar23);
    if (pHVar19 == (HalBuf *)0x0) {
      _mpp_log_l(2,"hal_av1d_vdpu","get slots frame buff fail","set_ref_dbase");
    }
    else {
      iVar45 = mpp_buffer_get_fd_with_caller(*pHVar19->buf,"set_ref_dbase");
      mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 0x48),0x87,RVar46 + iVar44 + 0x40);
      *(int *)(lVar38 + 0x21c) = iVar45;
    }
    *(undefined4 *)(lVar34 + 0x108) = 0;
    *(undefined4 *)(lVar34 + 400) = 0;
    *(undefined4 *)(lVar34 + 0x218) = 0;
    *(uint *)(lVar34 + 0xec) =
         *(uint *)(lVar34 + 0xec) & 0xefffffff | (piVar8[lVar35 + 0x79e2] & 1U) << 0x1c;
    puVar40 = puVar40 + 0x1b;
    lVar35 = lVar35 + 1;
    uVar54 = (ulong)(uint)uVar7;
  } while (lVar35 != 7);
  *(uint *)(lVar34 + 0x2e0) =
       *(uint *)(lVar34 + 0x2e0) & 0xe7ffffff | (*(byte *)((long)pvVar9 + 0x7a6) & 3) << 0x1b;
  *(uint *)(lVar34 + 0x2e4) =
       *(uint *)(lVar34 + 0x2e4) & 0xe7ffffff | (*(byte *)((long)pvVar9 + 0x812) & 3) << 0x1b;
  *(uint *)(lVar34 + 0x2e8) =
       *(uint *)(lVar34 + 0x2e8) & 0xe7ffffff | (*(byte *)((long)pvVar9 + 0x87e) & 3) << 0x1b;
  *(uint *)(lVar34 + 0x2ec) =
       *(uint *)(lVar34 + 0x2ec) & 0xe7ffffff | (*(byte *)((long)pvVar9 + 0x8ea) & 3) << 0x1b;
  *(uint *)(lVar34 + 0x2f0) =
       *(uint *)(lVar34 + 0x2f0) & 0xe7ffffff | (*(byte *)((long)pvVar9 + 0x956) & 3) << 0x1b;
  *(uint *)(lVar34 + 0x404) =
       *(uint *)(lVar34 + 0x404) & 0xe7ffffff | (*(byte *)((long)pvVar9 + 0x9c2) & 3) << 0x1b;
  *(uint *)(lVar34 + 0x418) =
       *(uint *)(lVar34 + 0x418) & 0xe7ffffff | (*(byte *)((long)pvVar9 + 0xa2e) & 3) << 0x1b;
  if ((*(byte *)((long)pvVar9 + 0x17) & 2) == 0) {
    if (!bVar57) {
      uVar71 = *(undefined1 *)((long)pvVar9 + 0x7a4);
      goto code_r0x00217af9;
    }
  }
  else {
    uVar71 = *(undefined1 *)((long)pvVar9 + 10);
code_r0x00217af9:
    *(undefined1 *)(piVar8 + 0x79e0) = uVar71;
  }
  bVar41 = *(byte *)((long)pvVar9 + 0x530);
  uVar33 = (uint)bVar41;
  refs_selected[2] = 0;
  refs_selected[0] = 0;
  refs_selected[1] = 0;
  uVar6 = *(ushort *)((long)pvVar9 + 2);
  uVar7 = *(ushort *)((long)pvVar9 + 4);
  mf_types[2] = '\0';
  mf_types[0] = '\0';
  mf_types[1] = '\0';
  uVar54 = 0;
  uVar61 = 0;
  if (-1 < *(char *)((long)pvVar9 + 0xa2c)) {
    uVar61 = (ulong)*(uint *)((long)pvVar9 + 0xa04);
  }
  if (-1 < *(char *)((long)pvVar9 + 0x8e8)) {
    uVar54 = (ulong)*(uint *)((long)pvVar9 + 0x8c0);
  }
  uVar50 = 0;
  uVar56 = 0;
  if (-1 < *(char *)((long)pvVar9 + 0x954)) {
    uVar56 = (ulong)*(uint *)((long)pvVar9 + 0x92c);
  }
  if (-1 < *(char *)((long)pvVar9 + 0x9c0)) {
    uVar50 = (ulong)*(uint *)((long)pvVar9 + 0x998);
  }
  if (((byte)hal_av1d_debug & 8) != 0) {
    _mpp_log_l(4,"hal_av1d_vdpu","frame_offset[%d %d %d %d] lst_idx %d alt_off %d\n",(char *)0x0,
               uVar61,uVar54,uVar56,uVar50,(ulong)(uint)(int)*(char *)((long)pvVar9 + 0x7a4),
               (ulong)*(uint *)((long)pvVar9 + 0x798));
  }
  uVar23 = uVar6 + 7 >> 3;
  uVar43 = uVar7 + 7 >> 3;
  uVar11 = 0;
  if (*(char *)((long)pvVar9 + 0x7a4) < '\0') {
    iVar44 = 2;
  }
  else {
    iVar44 = 1;
    if ((((*(int *)((long)pvVar9 + 0x798) != (int)uVar54) && (*(int *)((long)pvVar9 + 0x7a0) == 0))
        && (*(int *)((long)pvVar9 + 0x774) + 7U >> 3 == uVar23)) &&
       ((*(int *)((long)pvVar9 + 0x778) + 7U >> 3 == uVar43 && (*(int *)((long)pvVar9 + 0x79c) == 0)
        ))) {
      mf_types[0] = '\x01';
      refs_selected._0_8_ = refs_selected._0_8_ & 0xffffffff00000000;
      uVar11 = 1;
    }
  }
  if (*(char *)((long)pvVar9 + 0x531) == '\0') {
code_r0x00217dd3:
    uVar24 = uVar11;
    if ((((-1 < *(char *)((long)pvVar9 + 0x810)) && (*(int *)((long)pvVar9 + 0x80c) == 0)) &&
        (*(int *)((long)pvVar9 + 0x7e0) + 7U >> 3 == uVar23)) &&
       ((*(int *)((long)pvVar9 + 0x7e4) + 7U >> 3 == uVar43 && (*(int *)((long)pvVar9 + 0x808) == 0)
        ))) {
      mf_types[uVar11] = '\x02';
      uVar24 = uVar11 + 1;
      refs_selected[uVar11] = 1;
    }
  }
  else {
    uVar27 = (int)uVar56 - (uint)bVar41;
    uVar26 = 1 << (*(char *)((long)pvVar9 + 0x531) - 1U & 0x1f);
    uVar24 = uVar26 - 1;
    uVar25 = uVar11;
    if ((((int)(uVar27 & uVar26) < (int)(uVar24 & uVar27)) && (*(int *)((long)pvVar9 + 0x950) == 0))
       && ((*(int *)((long)pvVar9 + 0x924) + 7U >> 3 == uVar23 &&
           ((*(int *)((long)pvVar9 + 0x928) + 7U >> 3 == uVar43 &&
            (*(int *)((long)pvVar9 + 0x94c) == 0)))))) {
      mf_types[uVar11] = '\x05';
      uVar25 = uVar11 + 1;
      refs_selected[uVar11] = 4;
      iVar44 = iVar44 + -1;
    }
    uVar27 = (int)uVar50 - (uint)bVar41;
    uVar11 = uVar25;
    if (((((int)(uVar27 & uVar26) < (int)(uVar24 & uVar27)) && (*(int *)((long)pvVar9 + 0x9bc) == 0)
         ) && (*(int *)((long)pvVar9 + 0x990) + 7U >> 3 == uVar23)) &&
       ((*(int *)((long)pvVar9 + 0x994) + 7U >> 3 == uVar43 && (*(int *)((long)pvVar9 + 0x9b8) == 0)
        ))) {
      mf_types[uVar25] = '\x06';
      uVar11 = uVar25 + 1;
      refs_selected[uVar25] = 5;
      iVar44 = iVar44 + -1;
    }
    uVar25 = (int)uVar61 - uVar33;
    if (-1 < iVar44 && (int)(uVar26 & uVar25) < (int)(uVar24 & uVar25)) {
      if (((*(int *)((long)pvVar9 + 0xa28) != 0) ||
          (*(int *)((long)pvVar9 + 0x9fc) + 7U >> 3 != uVar23)) ||
         ((*(int *)((long)pvVar9 + 0xa00) + 7U >> 3 != uVar43 ||
          (*(int *)((long)pvVar9 + 0xa24) != 0)))) goto code_r0x00217dd3;
      mf_types[uVar11] = '\a';
      refs_selected[uVar11] = 6;
      iVar44 = iVar44 + -1;
      uVar11 = uVar11 + 1;
    }
    uVar24 = uVar11;
    if (-1 < iVar44) goto code_r0x00217dd3;
  }
  puVar40 = (uint *)((long)pvVar9 + 0x77c);
  uVar54 = 0;
  do {
    uVar11 = puVar40[10];
    if ((char)uVar11 < 0) {
      cur_offset[uVar54] = 0;
      *(undefined4 *)(local_1a58 + uVar54 * 4) = 0;
    }
    else {
      uVar25 = *puVar40;
      if (*(char *)((long)pvVar9 + 0x531) == '\0') {
        uVar61 = 0;
        uVar50 = 0;
      }
      else {
        uVar26 = 1 << (*(char *)((long)pvVar9 + 0x531) - 1U & 0x1f);
        uVar61 = (ulong)((uVar26 - 1 & uVar33 - uVar25) - (uVar33 - uVar25 & uVar26));
        uVar50 = (ulong)((uVar26 - 1 & uVar25 - uVar33) - (uVar25 - uVar33 & uVar26));
      }
      cur_offset[uVar54] = (RK_S32)uVar61;
      *(int *)(local_1a58 + uVar54 * 4) = (int)uVar50;
      if (((byte)hal_av1d_debug & 8) != 0) {
        _mpp_log_l(4,"hal_av1d_vdpu","buf_idx[%d]=%d offset[%d : %d] hin %d\n",(char *)0x0,
                   uVar54 & 0xffffffff,(ulong)(uint)(int)(char)uVar11,uVar61,uVar50,(ulong)uVar25);
      }
    }
    uVar54 = uVar54 + 1;
    puVar40 = puVar40 + 0x1b;
  } while (uVar54 != 7);
  uVar33 = *(uint *)(lVar34 + 0x2c) & 0xfffffff0;
  *(uint *)(lVar34 + 0x2c) = uVar33;
  uVar54 = *(ulong *)((long)pvVar9 + 0x14) & 0x4000000000;
  if (((uVar54 != 0) && (uVar24 != 0)) && (cur_offset[(ulong)mf_types[0] - 1] + 0x1fU < 0x3f)) {
    uVar33 = uVar33 | 8;
    *(uint *)(lVar34 + 0x2c) = uVar33;
    if (*(char *)((long)pvVar9 + 0x531) == '\0') {
      uVar11 = 0;
      uVar25 = 0;
      uVar26 = 0;
      uVar27 = 0;
      uVar28 = 0;
      uVar54 = 0;
    }
    else {
      uVar29 = 1 << (*(char *)((long)pvVar9 + 0x531) - 1U & 0x1f);
      lVar35 = (long)refs_selected[0] * 0x6c;
      iVar44 = *(int *)((long)pvVar9 + lVar35 + 0x77c);
      uVar11 = uVar29 + 0x1ff;
      uVar30 = iVar44 - *(int *)((long)pvVar9 + lVar35 + 0x798);
      piVar14 = (int *)((long)pvVar9 + lVar35 + 0x780);
      uVar25 = ((uVar11 & iVar44 - *piVar14) - (uVar29 & iVar44 - *piVar14)) * 0x400000 & 0x7fc00000
      ;
      uVar26 = ((uVar11 & iVar44 - piVar14[1]) - (uVar29 & iVar44 - piVar14[1])) * 0x400000 &
               0x7fc00000;
      uVar27 = ((uVar11 & iVar44 - piVar14[2]) - (uVar29 & iVar44 - piVar14[2])) * 0x400000 &
               0x7fc00000;
      uVar28 = ((uVar11 & iVar44 - piVar14[3]) - (uVar29 & iVar44 - piVar14[3])) * 0x400000 &
               0x7fc00000;
      uVar4 = *(undefined8 *)((long)pvVar9 + lVar35 + 0x790);
      uVar61 = CONCAT44(iVar44 - (int)((ulong)uVar4 >> 0x20),iVar44 - (int)uVar4);
      uVar54 = CONCAT44(uVar11,uVar11) & uVar61;
      uVar61 = CONCAT44(uVar29,uVar29) & uVar61;
      uVar54 = CONCAT44(((int)(uVar54 >> 0x20) - (int)(uVar61 >> 0x20)) * 0x400000,
                        ((int)uVar54 - (int)uVar61) * 0x400000) & (ulong)UNK_002aa380;
      uVar11 = ((uVar30 & uVar11) - (uVar30 & uVar29) & 0x1ff) << 0x16;
    }
    *(uint *)(lVar34 + 0x50) = *(uint *)(lVar34 + 0x50) & 0x803fffff | uVar25;
    *(uint *)(lVar34 + 0x54) = *(uint *)(lVar34 + 0x54) & 0x803fffff | uVar26;
    *(uint *)(lVar34 + 0x58) = *(uint *)(lVar34 + 0x58) & 0x803fffff | uVar27;
    *(uint *)(lVar34 + 0x5c) = *(uint *)(lVar34 + 0x5c) & 0x803fffff | uVar28;
    *(ulong *)(lVar34 + 0x60) = *(ulong *)(lVar34 + 0x60) & (ulong)UNK_002aa3a0 | uVar54;
    *(uint *)(lVar34 + 0x68) = *(uint *)(lVar34 + 0x68) & 0x803fffff | uVar11;
    uVar54 = *(ulong *)((long)pvVar9 + 0x14) & 0x4000000000;
  }
  if ((uVar54 != 0) && (1 < uVar24)) {
    uVar54 = 1;
    if (cur_offset[(ulong)mf_types[1] - 1] + 0x1fU < 0x3f) {
      uVar33 = uVar33 | 4;
      *(uint *)(lVar34 + 0x2c) = uVar33;
      if (*(char *)((long)pvVar9 + 0x531) == '\0') {
        uVar11 = 0;
        uVar54 = 0;
      }
      else {
        lVar35 = (long)refs_selected[1] * 0x6c;
        iVar44 = *(int *)((long)pvVar9 + lVar35 + 0x77c);
        uVar11 = iVar44 - *(int *)((long)pvVar9 + lVar35 + 0x780);
        uVar26 = 1 << (*(char *)((long)pvVar9 + 0x531) - 1U & 0x1f);
        uVar25 = uVar26 + 0x1ff;
        uVar11 = ((uVar11 & uVar25) - (uVar11 & uVar26) & 0x1ff) << 0x16;
        uVar61 = CONCAT44(iVar44 - *(int *)((long)pvVar9 + lVar35 + 0x790),
                          iVar44 - *(int *)((long)pvVar9 + lVar35 + 0x784));
        uVar58 = CONCAT44(uVar25,uVar25);
        uVar54 = uVar61 & uVar58;
        uVar64 = CONCAT44(uVar26,uVar26);
        uVar61 = uVar61 & uVar64;
        uVar56 = CONCAT44(iVar44 - *(int *)((long)pvVar9 + lVar35 + 0x794),
                          iVar44 - *(int *)((long)pvVar9 + lVar35 + 0x788));
        uVar50 = uVar56 & uVar58;
        uVar56 = uVar56 & uVar64;
        iVar45 = *(int *)((long)pvVar9 + lVar35 + 0x798);
        iVar53 = *(int *)((long)pvVar9 + lVar35 + 0x78c);
        in_XMM6._4_4_ = iVar45;
        in_XMM6._0_4_ = iVar53;
        in_XMM6._8_8_ = 0;
        uVar60 = CONCAT44(iVar44 - iVar45,iVar44 - iVar53);
        uVar58 = uVar58 & uVar60;
        uVar60 = uVar60 & uVar64;
        uVar54 = CONCAT44(((int)(uVar58 >> 0x20) - (int)(uVar60 >> 0x20)) * 0x40000,
                          ((int)uVar58 - (int)uVar60) * 0x40000) & (ulong)UNK_002aa3d0 |
                 CONCAT44(((int)(uVar50 >> 0x20) - (int)(uVar56 >> 0x20)) * 0x200,
                          ((int)uVar50 - (int)uVar56) * 0x200) & (ulong)UNK_002aa3c0 |
                 CONCAT44((int)(uVar54 >> 0x20) - (int)(uVar61 >> 0x20),(int)uVar54 - (int)uVar61) &
                 (ulong)UNK_002aa3b0;
      }
      *(uint *)(lVar34 + 0x6c) = *(uint *)(lVar34 + 0x6c) & 0x803fffff | uVar11;
      *(ulong *)(lVar34 + 0xbc) = *(ulong *)(lVar34 + 0xbc) & (ulong)DAT_002a0ab0 | uVar54;
      uVar54 = *(ulong *)((long)pvVar9 + 0x14) & 0x4000000000;
    }
  }
  if (((uVar54 != 0) && (2 < uVar24)) && (cur_offset[(ulong)mf_types[2] - 1] + 0x1fU < 0x3f)) {
    *(uint *)(lVar34 + 0x2c) = uVar33 | 2;
    if (*(char *)((long)pvVar9 + 0x531) == '\0') {
      uVar11 = 0;
      uVar25 = 0;
      uVar26 = 0;
      uVar27 = 0;
      uVar28 = 0;
      uVar33 = 0;
      uVar24 = 0;
    }
    else {
      uVar30 = 1 << (*(char *)((long)pvVar9 + 0x531) - 1U & 0x1f);
      lVar35 = (long)refs_selected[2] * 0x6c;
      iVar44 = *(int *)((long)pvVar9 + lVar35 + 0x77c);
      uVar24 = uVar30 + 0x1ff;
      uVar33 = iVar44 - *(int *)((long)pvVar9 + lVar35 + 0x790);
      uVar11 = iVar44 - *(int *)((long)pvVar9 + lVar35 + 0x794);
      uVar29 = iVar44 - *(int *)((long)pvVar9 + lVar35 + 0x798);
      piVar14 = (int *)((long)pvVar9 + lVar35 + 0x780);
      uVar25 = ((uVar24 & iVar44 - *piVar14) - (uVar30 & iVar44 - *piVar14)) * 0x40000 & 0x7fc0000;
      uVar26 = ((uVar24 & iVar44 - piVar14[1]) - (uVar30 & iVar44 - piVar14[1])) * 0x40000 &
               0x7fc0000;
      uVar27 = ((uVar24 & iVar44 - piVar14[2]) - (uVar30 & iVar44 - piVar14[2])) * 0x40000 &
               0x7fc0000;
      uVar28 = ((uVar24 & iVar44 - piVar14[3]) - (uVar30 & iVar44 - piVar14[3])) * 0x40000 &
               0x7fc0000;
      uVar33 = ((uVar33 & uVar24) - (uVar33 & uVar30)) * 0x40000 & 0x7fc0000;
      uVar11 = ((uVar11 & uVar24) - (uVar11 & uVar30)) * 0x40000 & 0x7fc0000;
      uVar24 = ((uVar29 & uVar24) - (uVar29 & uVar30)) * 0x40000 & 0x7fc0000;
    }
    *(uint *)(lVar34 + 0x2e0) = *(uint *)(lVar34 + 0x2e0) & 0xf803ffff | uVar25;
    *(uint *)(lVar34 + 0x2e4) = *(uint *)(lVar34 + 0x2e4) & 0xf803ffff | uVar26;
    *(uint *)(lVar34 + 0x2e8) = *(uint *)(lVar34 + 0x2e8) & 0xf803ffff | uVar27;
    *(uint *)(lVar34 + 0x2ec) = *(uint *)(lVar34 + 0x2ec) & 0xf803ffff | uVar28;
    *(uint *)(lVar34 + 0x2f0) = *(uint *)(lVar34 + 0x2f0) & 0xf803ffff | uVar33;
    *(uint *)(lVar34 + 0x404) = *(uint *)(lVar34 + 0x404) & 0xf803ffff | uVar11;
    *(uint *)(lVar34 + 0x418) = *(uint *)(lVar34 + 0x418) & 0xf803ffff | uVar24;
  }
  if (((*(char *)((long)pvVar9 + 0x57c) != '\0') && ((ulong)*(byte *)((long)pvVar9 + 0x52e) < 7)) &&
     (cVar5 = *(char *)((long)pvVar9 + (ulong)*(byte *)((long)pvVar9 + 0x52e) * 0x6c + 0x7a4),
     -1 < cVar5)) {
    uVar33 = piVar8[0x6d1e];
    pHVar19 = hal_bufs_get_buf(*(HalBufs *)(piVar8 + 0x79ec),(int)cVar5);
    *(undefined4 *)(lVar34 + 0x140) = 0;
    iVar44 = mpp_buffer_get_fd_with_caller(*pHVar19->buf,"vdpu_av1d_set_reference_frames");
    *(int *)(lVar34 + 0x144) = iVar44;
    mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 0x48),0x51,uVar33 + (uVar33 >> 1) + 0x40);
    *(byte *)(lVar34 + 0x2c) = *(byte *)(lVar34 + 0x2c) | 1;
  }
  uVar54 = (ulong)*(byte *)((long)pvVar9 + 0x52e);
  if (uVar54 < 7) {
    bVar57 = true;
    if (uVar23 == puVar1[uVar54 * 0x1b] + 7 >> 3) {
      bVar57 = uVar43 != puVar1[uVar54 * 0x1b + 1] + 7 >> 3;
    }
    *(bool *)((long)piVar8 + 0x1e782) = bVar57;
  }
  auVar90._0_4_ = cur_offset[0] << 9;
  auVar90._4_4_ = cur_offset[1] << 9;
  auVar90._8_4_ = cur_offset[2] << 9;
  auVar90._12_4_ = cur_offset[3] << 9;
  *(undefined1 (*) [16])(lVar34 + 0x2e0) =
       local_1a58 & _UNK_002aa420 | *(undefined1 (*) [16])(lVar34 + 0x2e0) & _UNK_002aa410 |
       auVar90 & _UNK_002aa400;
  *(uint *)(lVar34 + 0x2f0) =
       uStack_1a48 & 0x1ff | *(uint *)(lVar34 + 0x2f0) & 0xfffc0000 | (cur_offset[4] & 0x1ffU) << 9;
  *(uint *)(lVar34 + 0x404) =
       uStack_1a44 & 0x1ff | *(uint *)(lVar34 + 0x404) & 0xfffc0000 | (cur_offset[5] & 0x1ffU) << 9;
  *(uint *)(lVar34 + 0x418) =
       uStack_1a40 & 0x1ff | *(uint *)(lVar34 + 0x418) & 0xfffc0000 | (cur_offset[6] & 0x1ffU) << 9;
  *(uint *)(lVar34 + 0x24) =
       (uint)(mf_types[2] - 1 & 7) << 0xb |
       (uint)(mf_types[1] - 1 & 7) << 8 |
       *(uint *)(lVar34 + 0x24) & 0xffffc01f | (uint)(byte)(mf_types[0] * ' ' - 0x20);
  if (((byte)hal_av1d_debug & 8) != 0) {
    _mpp_log_l(4,"hal_av1d_vdpu","mf_types[%d %d %d]\n",(char *)0x0,(ulong)mf_types[0],
               (ulong)mf_types[1],(ulong)mf_types[2]);
  }
  *(uint *)(lVar34 + 0x14) = *(uint *)(lVar34 + 0x14) & 0xfffffffe | uVar39;
LAB_002185df:
  lVar34 = *(long *)(piVar8 + 0x79ea);
  uVar33 = *(uint *)(lVar34 + 0x14);
  uVar39 = (*(uint *)(lVar34 + 0x34) & 0xfffffffb) + (*(byte *)((long)pvVar9 + 0x57f) & 1) * 4;
  *(uint *)(lVar34 + 0x34) = uVar39;
  uVar39 = (uVar39 & 0xfffffffd) + (*(byte *)((long)pvVar9 + 0x57d) & 1) * 2;
  *(uint *)(lVar34 + 0x34) = uVar39;
  *(uint *)(lVar34 + 0x34) = uVar39 & 0xfffffffe | *(byte *)((long)pvVar9 + 0x57c) & 1;
  uVar39 = (uint)((ulong)*(undefined8 *)((long)pvVar9 + 0x14) >> 0x27) & 4;
  *(uint *)(lVar34 + 0x14) = uVar33 & 0xfffffffb | uVar39;
  if (((*(byte *)((long)pvVar9 + 0x528) & 0xfd) == 0) || (uVar39 != 0)) {
    *(byte *)(lVar34 + 0x2c) = *(byte *)(lVar34 + 0x2c) & 0xfe;
  }
  uVar25 = (uint)*(byte *)((long)pvVar9 + 0x532) << 0x1a;
  uVar11 = *(uint *)(lVar34 + 0x38);
  *(uint *)(lVar34 + 0x38) = uVar11 & 0x3ffffff | uVar25;
  uVar26 = (uint)*(byte *)((long)pvVar9 + 0x533) << 0x1a;
  uVar23 = *(uint *)(lVar34 + 0x3c);
  *(uint *)(lVar34 + 0x3c) = uVar23 & 0x3ffffff | uVar26;
  uVar27 = (uint)*(byte *)((long)pvVar9 + 0x534) << 0x1a;
  uVar43 = *(uint *)(lVar34 + 0x40);
  *(uint *)(lVar34 + 0x40) = uVar43 & 0x3ffffff | uVar27;
  uVar28 = (uint)*(byte *)((long)pvVar9 + 0x535) << 0x1a;
  uVar24 = *(uint *)(lVar34 + 0x44);
  *(uint *)(lVar34 + 0x44) = uVar24 & 0x3ffffff | uVar28;
  uVar29 = 0;
  memset(ref_count,0,0x100);
  if (*(char *)((long)pvVar9 + 0x57c) != '\0') {
    cVar5 = *(char *)((long)pvVar9 + 0x528);
    lVar38 = 0;
    lVar35 = 0;
    bVar41 = 0;
    do {
      bVar42 = *(byte *)((long)pvVar9 + lVar35 + 0x580);
      if ((bVar42 & 1) != 0) {
        uVar29 = *(uint *)((long)pvVar9 + lVar38 + 0x588);
        uVar30 = -uVar29;
        if (0 < (int)uVar29) {
          uVar30 = uVar29;
        }
        if (0xfe < uVar30) {
          uVar30 = 0xff;
        }
        *(uint *)((long)ref_count + lVar38) = uVar30;
        bVar41 = bVar41 | (byte)((uVar29 >> 0x1f) << ((byte)lVar35 & 0x1f));
      }
      if ((bVar42 & 2) != 0) {
        iVar44 = *(int *)((long)pvVar9 + lVar38 + 0x58c);
        if (0x3e < iVar44) {
          iVar44 = 0x3f;
        }
        if (iVar44 < -0x3e) {
          iVar44 = -0x3f;
        }
        *(int *)((long)ref_count + lVar38 + 4) = iVar44;
      }
      if ((bVar42 & 4) != 0) {
        iVar44 = *(int *)((long)pvVar9 + lVar38 + 0x590);
        if (0x3e < iVar44) {
          iVar44 = 0x3f;
        }
        if (iVar44 < -0x3e) {
          iVar44 = -0x3f;
        }
        *(int *)((long)ref_count + lVar38 + 8) = iVar44;
      }
      if ((bVar42 & 8) != 0) {
        iVar44 = *(int *)((long)pvVar9 + lVar38 + 0x594);
        if (0x3e < iVar44) {
          iVar44 = 0x3f;
        }
        if (iVar44 < -0x3e) {
          iVar44 = -0x3f;
        }
        *(int *)((long)ref_count + lVar38 + 0xc) = iVar44;
      }
      if ((bVar42 & 0x10) != 0) {
        iVar44 = *(int *)((long)pvVar9 + lVar38 + 0x598);
        if (0x3e < iVar44) {
          iVar44 = 0x3f;
        }
        if (iVar44 < -0x3e) {
          iVar44 = -0x3f;
        }
        *(int *)((long)ref_count + lVar38 + 0x10) = iVar44;
      }
      if ((cVar5 != '\0') && ((bVar42 & 0x20) != 0)) {
        *(int *)((long)ref_count + lVar38 + 0x14) = *(int *)((long)pvVar9 + lVar38 + 0x59c) + 1;
      }
      if ((bVar42 & 0x40) != 0) {
        *(undefined4 *)((long)ref_count + lVar38 + 0x18) = 1;
      }
      if ((char)bVar42 < '\0') {
        *(undefined4 *)((long)ref_count + lVar38 + 0x1c) = 1;
      }
      lVar35 = lVar35 + 1;
      lVar38 = lVar38 + 0x20;
    } while (lVar35 != 8);
    uVar29 = (uint)bVar41 << 2;
  }
  lVar35 = 0;
  bVar41 = 0;
  uVar30 = 0;
  do {
    bVar42 = *(byte *)((long)pvVar9 + lVar35 + 0x580);
    bVar63 = (byte)lVar35;
    auVar65[0] = (bVar63 < bVar41) * bVar41 | (bVar63 >= bVar41) * bVar63;
    uVar71 = (undefined1)((ulong)lVar35 >> 8);
    uVar74 = (undefined1)((ulong)lVar35 >> 0x10);
    uVar77 = (undefined1)((ulong)lVar35 >> 0x18);
    uVar80 = (undefined1)((ulong)lVar35 >> 0x20);
    uVar81 = (undefined1)((ulong)lVar35 >> 0x28);
    uVar82 = (undefined1)((ulong)lVar35 >> 0x30);
    bVar63 = (byte)((ulong)lVar35 >> 0x38);
    auVar69._0_13_ = ZEXT113(bVar63) << 0x38;
    auVar70._0_14_ = ZEXT114(bVar63) << 0x38;
    auVar95 = pshuflw(in_XMM6,ZEXT216(CONCAT11(bVar41,bVar41)),0);
    auVar97._1_3_ = 0;
    auVar97[0] = bVar42;
    auVar97[4] = bVar42;
    auVar97._5_3_ = 0;
    auVar97[8] = bVar42;
    auVar97._9_3_ = 0;
    auVar97[0xc] = bVar42;
    auVar97._13_3_ = 0;
    auVar90 = auVar97 & _DAT_002aa430;
    auVar97 = auVar97 & _DAT_002aa440;
    auVar98._0_4_ = -(uint)(auVar97._0_4_ == 0);
    auVar98._4_4_ = -(uint)(auVar97._4_4_ == 0);
    auVar98._8_4_ = -(uint)(auVar97._8_4_ == 0);
    auVar98._12_4_ = -(uint)(auVar97._12_4_ == 0);
    auVar91._0_4_ = -(uint)(auVar90._0_4_ == 0);
    auVar91._4_4_ = -(uint)(auVar90._4_4_ == 0);
    auVar91._8_4_ = -(uint)(auVar90._8_4_ == 0);
    auVar91._12_4_ = -(uint)(auVar90._12_4_ == 0);
    auVar90 = packssdw(auVar91,auVar98);
    auVar92 = packsswb(auVar90,auVar90);
    auVar70[0xe] = bVar63;
    auVar70[0xf] = bVar63;
    auVar69._14_2_ = auVar70._14_2_;
    auVar69[0xd] = uVar82;
    auVar68._13_3_ = auVar69._13_3_;
    auVar68._0_12_ = ZEXT112(bVar63) << 0x38;
    auVar68[0xc] = uVar82;
    auVar96._12_4_ = auVar68._12_4_;
    auVar96._0_11_ = ZEXT111(bVar63) << 0x38;
    auVar96[0xb] = uVar81;
    auVar67._11_5_ = auVar96._11_5_;
    auVar67._0_10_ = (unkuint10)bVar63 << 0x38;
    auVar67[10] = uVar81;
    auVar66._10_6_ = auVar67._10_6_;
    auVar66._0_9_ = (unkuint9)bVar63 << 0x38;
    auVar66[9] = uVar80;
    auVar65._8_8_ = (undefined8)(CONCAT72(auVar66._9_7_,CONCAT11(uVar80,bVar63)) >> 8);
    auVar65[7] = uVar77;
    auVar65[6] = uVar77;
    auVar65[5] = uVar74;
    auVar65[4] = uVar74;
    auVar65[3] = uVar71;
    auVar65[2] = uVar71;
    auVar65[1] = auVar65[0];
    auVar90 = pshuflw(auVar65,auVar65,0);
    auVar96 = auVar95 & auVar92 | ~auVar92 & auVar90;
    auVar90 = ~auVar92 & (ZEXT416(uVar30 & 0xff) | ZEXT816(0x101010000000000)) |
              ZEXT416(uVar30 & 0xff) & auVar92;
    bVar41 = auVar96[0];
    bVar42 = auVar96[4];
    bVar63 = (bVar42 < bVar41) * bVar41 | (bVar42 >= bVar41) * bVar42;
    bVar41 = auVar96[1];
    bVar73 = auVar96[5];
    bVar72 = (bVar73 < bVar41) * bVar41 | (bVar73 >= bVar41) * bVar73;
    bVar41 = auVar96[2];
    bVar76 = auVar96[6];
    bVar75 = (bVar76 < bVar41) * bVar41 | (bVar76 >= bVar41) * bVar76;
    bVar41 = auVar96[3];
    bVar79 = auVar96[7];
    bVar78 = (bVar79 < bVar41) * bVar41 | (bVar79 >= bVar41) * bVar79;
    bVar41 = auVar96[8];
    bVar83 = (bVar42 < bVar41) * bVar41 | (bVar42 >= bVar41) * bVar42;
    bVar41 = auVar96[9];
    bVar84 = (bVar73 < bVar41) * bVar41 | (bVar73 >= bVar41) * bVar73;
    bVar41 = auVar96[10];
    bVar85 = (bVar76 < bVar41) * bVar41 | (bVar76 >= bVar41) * bVar76;
    bVar41 = auVar96[0xb];
    bVar86 = (bVar79 < bVar41) * bVar41 | (bVar79 >= bVar41) * bVar79;
    bVar41 = auVar96[0xc];
    bVar87 = (bVar42 < bVar41) * bVar41 | (bVar42 >= bVar41) * bVar42;
    bVar41 = auVar96[0xd];
    bVar88 = (bVar73 < bVar41) * bVar41 | (bVar73 >= bVar41) * bVar73;
    bVar41 = auVar96[0xe];
    bVar89 = (bVar76 < bVar41) * bVar41 | (bVar76 >= bVar41) * bVar76;
    bVar41 = auVar96[0xf];
    bVar41 = (bVar79 < bVar41) * bVar41 | (bVar79 >= bVar41) * bVar79;
    in_XMM6[0] = (bVar75 < bVar63) * bVar63 | (bVar75 >= bVar63) * bVar75;
    in_XMM6[1] = (bVar78 < bVar72) * bVar72 | (bVar78 >= bVar72) * bVar78;
    in_XMM6[2] = (bVar75 != 0) * bVar75;
    in_XMM6[3] = (bVar78 != 0) * bVar78;
    in_XMM6[4] = (bVar76 < bVar42) * bVar42 | (bVar76 >= bVar42) * bVar76;
    in_XMM6[5] = (bVar79 < bVar73) * bVar73 | (bVar79 >= bVar73) * bVar79;
    in_XMM6[6] = (bVar76 != 0) * bVar76;
    in_XMM6[7] = (bVar79 != 0) * bVar79;
    in_XMM6[8] = (bVar85 < bVar83) * bVar83 | (bVar85 >= bVar83) * bVar85;
    in_XMM6[9] = (bVar86 < bVar84) * bVar84 | (bVar86 >= bVar84) * bVar86;
    in_XMM6[10] = (bVar85 != 0) * bVar85;
    in_XMM6[0xb] = (bVar86 != 0) * bVar86;
    in_XMM6[0xc] = (bVar89 < bVar87) * bVar87 | (bVar89 >= bVar87) * bVar89;
    in_XMM6[0xd] = (bVar41 < bVar88) * bVar88 | (bVar41 >= bVar88) * bVar41;
    in_XMM6[0xe] = (bVar89 != 0) * bVar89;
    in_XMM6[0xf] = (bVar41 != 0) * bVar41;
    bVar41 = (in_XMM6[1] < in_XMM6[0]) * in_XMM6[0] | (in_XMM6[1] >= in_XMM6[0]) * in_XMM6[1];
    uVar94 = auVar90._4_4_;
    auVar92._4_4_ = uVar94;
    auVar92._0_4_ = uVar94;
    auVar92._8_4_ = uVar94;
    auVar92._12_4_ = uVar94;
    auVar92 = auVar92 | auVar90;
    auVar93._0_4_ = auVar92._0_4_ >> 0x10;
    auVar93._4_4_ = 0;
    auVar93._8_4_ = auVar92._8_4_ >> 0x10;
    auVar93._12_4_ = auVar92._12_4_ >> 0x10;
    auVar93 = auVar93 | auVar92;
    auVar95._0_2_ = auVar93._0_2_ >> 8;
    auVar95._2_6_ = 0;
    auVar95._8_2_ = auVar93._8_2_ >> 8;
    auVar95._10_2_ = auVar93._10_2_ >> 8;
    auVar95._12_2_ = auVar93._12_2_ >> 8;
    auVar95._14_2_ = auVar93._14_2_ >> 8;
    uVar30 = SUB164(auVar95 | auVar93,0);
    lVar35 = lVar35 + 1;
  } while (lVar35 != 8);
  *(uint *)(lVar34 + 0x24) = *(uint *)(lVar34 + 0x24) & 0xfff1ffff | (uint)(bVar41 & 7) << 0x11;
  *(uint *)(lVar34 + 0x14) =
       uVar33 & 0xffeffffb | uVar39 | (uint)(SUB161(auVar95 | auVar93,0) & 1) << 0x14;
  *(uint *)(lVar34 + 0x30) = *(uint *)(lVar34 + 0x30) & 0xfffffc03 | uVar29;
  *(uint *)(lVar34 + 0x38) =
       (ref_count[6] & 1U) << 0xe |
       (ref_count[5] & 0xfU) << 0xf |
       (ref_count[1] & 0x7fU) << 0x13 | uVar11 & 0x3f00 | uVar25 | (uint)(byte)ref_count[0];
  *(uint *)(lVar34 + 0x3c) =
       (ref_count[0xe] & 1U) << 0xe |
       (ref_count[0xd] & 0xfU) << 0xf |
       (ref_count[9] & 0x7fU) << 0x13 | uVar23 & 0x3f00 | uVar26 | (uint)(byte)ref_count[8];
  *(ulong *)(lVar34 + 0x50) =
       CONCAT44(ref_count[0xf] << 0x15,ref_count[7] << 0x15) & (ulong)DAT_002aa4a0 |
       CONCAT44(ref_count[0xc] << 0xe,ref_count[4] << 0xe) & (ulong)DAT_002aa490 |
       CONCAT44(ref_count[0xb] << 7,ref_count[3] << 7) & (ulong)DAT_002aa480 |
       *(ulong *)(lVar34 + 0x50) & 0xffc00000ffc00000 |
       CONCAT44(ref_count[10],ref_count[2]) & 0x7f0000007f;
  *(uint *)(lVar34 + 0x40) =
       (ref_count[0x16] & 1U) << 0xe |
       (ref_count[0x15] & 0xfU) << 0xf |
       (ref_count[0x11] & 0x7fU) << 0x13 | uVar43 & 0x3f00 | uVar27 | (uint)(byte)ref_count[0x10];
  *(uint *)(lVar34 + 0x58) =
       (ref_count[0x17] & 1U) << 0x15 |
       (ref_count[0x14] & 0x7fU) << 0xe |
       (ref_count[0x13] & 0x7fU) << 7 |
       *(uint *)(lVar34 + 0x58) & 0xffc00000 | ref_count[0x12] & 0x7fU;
  *(uint *)(lVar34 + 0x44) =
       (local_9190 & 1) << 0xe |
       (local_9194 & 0xf) << 0xf |
       (local_91a4 & 0x7f) << 0x13 | uVar24 & 0x3f00 | uVar28 | (uint)local_91a8;
  *(uint *)(lVar34 + 0x5c) =
       (local_918c & 1) << 0x15 |
       (local_9198 & 0x7f) << 0xe |
       (local_919c & 0x7f) << 7 | *(uint *)(lVar34 + 0x5c) & 0xffc00000 | local_91a0 & 0x7f;
  *(uint *)(lVar34 + 0x48) =
       (local_9170 & 1) << 0xe |
       (local_9174 & 0xf) << 0xf |
       (local_9184 & 0x7f) << 0x13 | *(uint *)(lVar34 + 0x48) & 0xfc003f00 | (uint)local_9188;
  *(uint *)(lVar34 + 0x60) =
       (local_916c & 1) << 0x15 |
       (local_9178 & 0x7f) << 0xe |
       (local_917c & 0x7f) << 7 | *(uint *)(lVar34 + 0x60) & 0xffc00000 | local_9180 & 0x7f;
  *(uint *)(lVar34 + 0x4c) =
       (local_9150 & 1) << 0xe |
       (local_9154 & 0xf) << 0xf |
       (local_9164 & 0x7f) << 0x13 | *(uint *)(lVar34 + 0x4c) & 0xfc003f00 | (uint)local_9168;
  *(uint *)(lVar34 + 100) =
       (local_914c & 1) << 0x15 |
       (local_9158 & 0x7f) << 0xe |
       (local_915c & 0x7f) << 7 | *(uint *)(lVar34 + 100) & 0xffc00000 | local_9160 & 0x7f;
  *(uint *)(lVar34 + 0x7c) =
       (local_9130 & 1) << 0xe |
       (local_9134 & 0xf) << 0xf |
       (local_9144 & 0x7f) << 0x13 | *(uint *)(lVar34 + 0x7c) & 0xfc003f00 | (uint)local_9148;
  *(uint *)(lVar34 + 0x68) =
       (local_912c & 1) << 0x15 |
       (local_9138 & 0x7f) << 0xe |
       (local_913c & 0x7f) << 7 | *(uint *)(lVar34 + 0x68) & 0xffc00000 | local_9140 & 0x7f;
  *(uint *)(lVar34 + 0x80) =
       (local_9110 & 1) << 0xe |
       (local_9114 & 0xf) << 0xf |
       (local_9124 & 0x7f) << 0x13 | *(uint *)(lVar34 + 0x80) & 0xfc003f00 | (uint)local_9128;
  *(uint *)(lVar34 + 0x6c) =
       (local_910c & 1) << 0x15 |
       (local_9118 & 0x7f) << 0xe |
       (local_911c & 0x7f) << 7 | *(uint *)(lVar34 + 0x6c) & 0xffc00000 | local_9120 & 0x7f;
  lVar34 = *(long *)((long)hal + 0x50);
  lVar35 = *(long *)(lVar34 + 0x1e7a8);
  uVar39 = 0;
  if (*(char *)((long)pvVar9 + 0x532) == '\0') {
    uVar39 = (uint)(*(char *)((long)pvVar9 + 0x533) == '\0') << 0xe;
  }
  *(uint *)(lVar35 + 0xc) = *(uint *)(lVar35 + 0xc) & 0xffffbfff | uVar39;
  *(uint *)(lVar35 + 0x14) =
       (*(uint *)(lVar35 + 0x14) & 0xfffffffd) + (uint)(0x20 < *(byte *)((long)pvVar9 + 0x532)) * 2;
  uVar33 = (*(byte *)((long)pvVar9 + 0x536) & 7) << 0x1c;
  uVar39 = *(uint *)(lVar35 + 0x78);
  *(uint *)(lVar35 + 0x78) = uVar39 & 0x8fffffff | uVar33;
  if (*(char *)((long)pvVar9 + 0x537) == '\0') {
    *(uint *)(lVar35 + 0xec) = *(uint *)(lVar35 + 0xec) & 0xf0000000;
    *(uint *)(lVar35 + 0xc4) = *(uint *)(lVar35 + 0xc4) & 0xffffc000;
    uVar33 = uVar39 & 0x80000000 | uVar33;
  }
  else {
    uVar23 = (*(byte *)((long)pvVar9 + 0x53c) & 0x7f) << 0x15;
    uVar11 = *(uint *)(lVar35 + 0xec);
    *(uint *)(lVar35 + 0xec) = uVar11 & 0xf01fffff | uVar23;
    uVar43 = (*(byte *)((long)pvVar9 + 0x53d) & 0x7f) << 0xe;
    *(uint *)(lVar35 + 0xec) = uVar11 & 0xf0003fff | uVar23 | uVar43;
    uVar24 = (*(byte *)((long)pvVar9 + 0x53e) & 0x7f) << 7;
    *(uint *)(lVar35 + 0xec) = uVar11 & 0xf000007f | uVar23 | uVar43 | uVar24;
    *(uint *)(lVar35 + 0xec) =
         uVar11 & 0xf0000000 | uVar23 | uVar43 | uVar24 | *(byte *)((long)pvVar9 + 0x53f) & 0x7f;
    uVar23 = (*(byte *)((long)pvVar9 + 0x540) & 0x7f) << 7;
    *(uint *)(lVar35 + 0x78) = uVar39 & 0x8fffc07f | uVar33 | uVar23;
    uVar43 = *(byte *)((long)pvVar9 + 0x541) & 0x7f;
    *(uint *)(lVar35 + 0x78) = uVar39 & 0x8fffc000 | uVar33 | uVar23 | uVar43;
    uVar24 = (*(byte *)((long)pvVar9 + 0x542) & 0x7f) << 7;
    uVar11 = *(uint *)(lVar35 + 0xc4);
    *(uint *)(lVar35 + 0xc4) = uVar11 & 0xffffc07f | uVar24;
    *(uint *)(lVar35 + 0xc4) = uVar11 & 0xffffc000 | uVar24 | *(byte *)((long)pvVar9 + 0x543) & 0x7f
    ;
    uVar11 = (*(byte *)((long)pvVar9 + 0x544) & 0x7f) << 0x15;
    *(uint *)(lVar35 + 0x78) = uVar39 & 0x801fc000 | uVar33 | uVar23 | uVar43 | uVar11;
    uVar33 = uVar39 & 0x80000000 | uVar33 | uVar23 | uVar43 | uVar11 |
             (*(byte *)((long)pvVar9 + 0x545) & 0x7f) << 0xe;
  }
  *(uint *)(lVar35 + 0x78) = uVar33;
  iVar44 = mpp_buffer_get_fd_with_caller(*(MppBuffer *)(lVar34 + 0x58),"vdpu_av1d_set_loopfilter");
  *(int *)(lVar35 + 0x2cc) = iVar44;
  iVar44 = mpp_buffer_get_fd_with_caller(*(MppBuffer *)(lVar34 + 0x58),"vdpu_av1d_set_loopfilter");
  *(int *)(lVar35 + 0x2dc) = iVar44;
  mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 0x48),0xb7,*(RK_U32 *)(lVar34 + 0x74));
  lVar34 = *(long *)(*(long *)((long)hal + 0x50) + 0x1e7a8);
  uVar33 = (uint)*(ushort *)((long)pvVar9 + 2) * 0x10000 + 0x70000 & 0xfff80000;
  uVar39 = *(uint *)(lVar34 + 0x10);
  *(uint *)(lVar34 + 0x10) = uVar39 & 0x7ffff | uVar33;
  *(uint *)(lVar34 + 0x10) =
       uVar39 & 0x3f | uVar33 | *(int *)((long)pvVar9 + 4) * 8 + 0x38U & 0x7ffc0;
  bVar41 = 0;
  uVar33 = (uint)(ushort)-*(short *)((long)pvVar9 + 2) << 0x1d;
  uVar39 = *(uint *)(lVar34 + 0x30);
  *(uint *)(lVar34 + 0x30) = uVar39 & 0x1fffffff | uVar33;
  *(uint *)(lVar34 + 0x30) =
       uVar39 & 0x3ffffff | uVar33 | ((ushort)-*(short *)((long)pvVar9 + 4) & 7) << 0x1a;
  *(uint *)(lVar34 + 0x20) =
       *(uint *)(lVar34 + 0x20) & 0x1ffff | *(int *)((long)pvVar9 + 0xc70) << 0x11;
  *(uint *)(lVar34 + 0x24) =
       *(uint *)(lVar34 + 0x24) & 0xfffe3fff | (*(ushort *)((long)pvVar9 + 0xc) & 7) << 0xe;
  lVar34 = *(long *)((long)hal + 0x50);
  lVar35 = *(long *)(lVar34 + 0x1e7a8);
  uVar61 = SUB168(ZEXT416(0xe),0);
  uVar54 = SUB168(ZEXT416(0x38000),0);
  uVar39 = 0xe000e;
  if ((*(ulong *)((long)pvVar9 + 0x14) & 0x400000000) == 0) {
    uVar23 = 0;
  }
  else {
    uVar11 = (*(uint *)(lVar35 + 0x24) >> 0xe & 7) + 9;
    uVar33 = *(uint *)((long)pvVar9 + 0xc70);
    uVar23 = 0;
    uVar50 = (ulong)((uVar11 >> 1) + uVar33 * 8) / (ulong)uVar11;
    uVar11 = 0x10;
    if (uVar33 < 0x10) {
      uVar11 = uVar33;
    }
    uVar56 = (ulong)uVar11;
    if (uVar11 < (uint)uVar50) {
      uVar56 = uVar50;
    }
    iVar44 = (int)uVar56;
    if (iVar44 - uVar33 != 0) {
      uVar39 = iVar44 + 1U >> 1;
      iVar49 = (int)(uVar33 + 1) >> 1;
      iVar53 = (iVar44 * 0x4000 + (int)uVar33 / 2) / (int)uVar33;
      iVar51 = iVar49 - ((int)(uVar33 + 1) >> 0x1f) >> 1;
      iVar45 = (int)(uVar39 * 0x4000 + iVar51) / iVar49;
      uVar61 = CONCAT44(((int)((uVar39 - iVar49) * 0x2000 + iVar51) / iVar49 -
                        (int)(iVar45 * iVar49 + uVar39 * -0x4000) / 2) + 0x80,iVar45) &
               (ulong)DAT_002aa4d0;
      uVar39 = (int)((iVar44 + 1U >> 2) + iVar49 * 0x4000) / (int)uVar39 & 0xffffU |
               (int)((int)(uVar56 >> 1) + uVar33 * 0x4000) / iVar44 << 0x10;
      uVar54 = CONCAT44((((int)((iVar44 - uVar33) * 0x2000 + (int)uVar33 / 2) / (int)uVar33 -
                         (int)(iVar53 * uVar33 + iVar44 * -0x4000) / 2) + 0x80) * 0x4000,
                        iVar53 << 0xe) & (ulong)DAT_002aa4e0;
      uVar23 = 0x20000;
    }
  }
  *(uint *)(lVar35 + 0x4a8) = uVar39;
  *(ulong *)(lVar35 + 0xcc) = *(ulong *)(lVar35 + 0xcc) & (ulong)DAT_002aa4f0 | uVar54 | uVar61;
  *(uint *)(lVar35 + 0x14) = *(uint *)(lVar35 + 0x14) & 0xfffdffff | uVar23;
  iVar44 = mpp_buffer_get_fd_with_caller(*(MppBuffer *)(lVar34 + 0x58),"vdpu_av1d_superres_params");
  *(int *)(lVar35 + 0x164) = iVar44;
  mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 0x48),0x59,*(RK_U32 *)(lVar34 + 0x84));
  lVar34 = *(long *)((long)hal + 0x50);
  lVar35 = *(long *)(lVar34 + 0x1e7a8);
  uVar39 = *(uint *)(lVar35 + 0x1c);
  uVar33 = (*(byte *)((long)pvVar9 + 0x559) & 3) << 5;
  *(uint *)(lVar35 + 0x1c) = uVar39 & 0xffffff9f | uVar33;
  *(uint *)(lVar35 + 0x1c) =
       (uVar39 & 0xffffff87 | uVar33) + (*(uint *)((long)pvVar9 + 0x558) & 3) * 8;
  lVar38 = 0;
  uVar23 = 0;
  uVar39 = 0;
  uVar33 = 0;
  uVar11 = 0;
  do {
    if ((1L << (*(byte *)((long)pvVar9 + 0x559) & 0x3f)) * 2 == lVar38) break;
    uVar23 = uVar23 | (uint)*(byte *)((long)pvVar9 + lVar38 + 0x55a) << (bVar41 & 0x1f);
    uVar39 = uVar39 | (uint)*(byte *)((long)pvVar9 + lVar38 + 0x55b) << ((byte)lVar38 & 0x1f);
    uVar11 = uVar11 | (uint)*(byte *)((long)pvVar9 + lVar38 + 0x56a) << (bVar41 & 0x1f);
    uVar33 = uVar33 | (uint)*(byte *)((long)pvVar9 + lVar38 + 0x56b) << ((byte)lVar38 & 0x1f);
    lVar38 = lVar38 + 2;
    bVar41 = bVar41 + 4;
  } while (lVar38 != 0x10);
  *(uint *)(lVar35 + 0x41c) = uVar23;
  *(uint *)(lVar35 + 0x420) = uVar11;
  *(uint *)(lVar35 + 0xd4) = uVar33 & 0xffff | uVar39 << 0x10;
  iVar44 = mpp_buffer_get_fd_with_caller(*(MppBuffer *)(lVar34 + 0x58),"vdpu_av1d_set_cdef");
  *(int *)(lVar35 + 0x154) = iVar44;
  mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 0x48),0x55,*(RK_U32 *)(lVar34 + 0x7c));
  lVar34 = *(long *)((long)hal + 0x50);
  lVar35 = *(long *)(lVar34 + 0x1e7a8);
  bVar41 = *(byte *)((long)pvVar9 + 0x549);
  bVar42 = *(byte *)((long)pvVar9 + 0x54a);
  bVar63 = *(byte *)((long)pvVar9 + 0x54b);
  *(uint *)(lVar35 + 0x48) =
       *(uint *)(lVar35 + 0x48) & 0x3ffffff |
       (uint)*(byte *)((long)pvVar9 + 0x546) << 0x1a | (uint)*(byte *)((long)pvVar9 + 0x547) << 0x1c
       | (uint)*(byte *)((long)pvVar9 + 0x548) << 0x1e;
  *(uint *)(lVar35 + 0x4c) =
       *(uint *)(lVar35 + 0x4c) & 0x3ffffff |
       (uint)bVar41 << 0x1a | (uint)bVar42 << 0x1c | (uint)bVar63 << 0x1e;
  iVar44 = mpp_buffer_get_fd_with_caller(*(MppBuffer *)(lVar34 + 0x58),"vdpu_av1d_set_lr");
  *(int *)(lVar35 + 0x16c) = iVar44;
  mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 0x48),0x5b,*(RK_U32 *)(lVar34 + 0x8c));
  lVar34 = *(long *)(piVar8 + 0x79ea);
  pvVar20 = mpp_buffer_get_ptr_with_caller(*(MppBuffer *)(piVar8 + 0x12),"vdpu_av1d_set_fgs");
  if (*(char *)((long)pvVar9 + 0x68c) == '\0') {
    *(byte *)(lVar34 + 0x1c) = *(byte *)(lVar34 + 0x1c) & 0x7f;
  }
  else {
    uVar39 = *(uint *)(lVar34 + 0x1c);
    uVar33 = (uint)(*(char *)((long)pvVar9 + 0x696) != '\0') << 8;
    *(uint *)(lVar34 + 0x1c) = uVar39 & 0xfffffeff | uVar33;
    uVar11 = (uint)(*(char *)((long)pvVar9 + 0x697) != '\0') << 9;
    *(uint *)(lVar34 + 0x1c) = uVar39 & 0xfffffcff | uVar33 | uVar11;
    uVar23 = (uint)(*(char *)((long)pvVar9 + 0x698) != '\0') << 10;
    *(uint *)(lVar34 + 0x1c) = uVar39 & 0xfffff8ff | uVar33 | uVar11 | uVar23;
    *(uint *)(lVar34 + 0x20) =
         *(uint *)(lVar34 + 0x20) & 0xfffffff0 | *(byte *)((long)pvVar9 + 0x68d) & 0xf ^ 8;
    if (*(char *)((long)pvVar9 + 0x68e) == '\0') {
      uVar24 = (*(byte *)((long)pvVar9 + 0x727) ^ 0x80) << 0x11;
      uVar43 = *(uint *)(lVar34 + 0x70);
      *(uint *)(lVar34 + 0x70) = uVar43 & 0xfe01ffff | uVar24;
      uVar25 = (*(byte *)((long)pvVar9 + 0x728) ^ 0x80) << 9;
      *(uint *)(lVar34 + 0x70) = uVar43 & 0xfe0001ff | uVar24 | uVar25;
      *(uint *)(lVar34 + 0x70) =
           uVar43 & 0xfe000000 | uVar24 | uVar25 | *(ushort *)((long)pvVar9 + 0x730) & 0x1ff ^ 0x100
      ;
      uVar24 = (*(byte *)((long)pvVar9 + 0x729) ^ 0x80) << 0x11;
      uVar43 = *(uint *)(lVar34 + 0x74);
      *(uint *)(lVar34 + 0x74) = uVar43 & 0xfe01ffff | uVar24;
      uVar25 = (*(byte *)((long)pvVar9 + 0x72a) ^ 0x80) << 9;
      *(uint *)(lVar34 + 0x74) = uVar43 & 0xfe0001ff | uVar24 | uVar25;
      *(uint *)(lVar34 + 0x74) =
           uVar43 & 0xfe000000 | uVar24 | uVar25 | *(ushort *)((long)pvVar9 + 0x732) & 0x1ff ^ 0x100
      ;
    }
    else {
      *(ulong *)(lVar34 + 0x70) =
           *(ulong *)(lVar34 + 0x70) & (ulong)DAT_002aa500 | (ulong)DAT_002aa510;
    }
    uVar43 = (*(byte *)((long)pvVar9 + 0x692) & 1) << 0xb;
    *(uint *)(lVar34 + 0x1c) = uVar39 & 0xfffff0ff | uVar33 | uVar11 | uVar23 | uVar43;
    uVar24 = (*(byte *)((long)pvVar9 + 0x693) & 1) << 0xc;
    *(uint *)(lVar34 + 0x1c) = uVar39 & 0xffffe0ff | uVar33 | uVar11 | uVar23 | uVar43 | uVar24;
    uVar25 = (*(byte *)((long)pvVar9 + 0x68e) & 1) << 0xd;
    *(uint *)(lVar34 + 0x1c) =
         uVar39 & 0xffffc0ff | uVar33 | uVar11 | uVar23 | uVar43 | uVar24 | uVar25;
    *(uint *)(lVar34 + 0x1c) =
         uVar39 & 0xc00000ff | uVar33 | uVar11 | uVar23 | uVar43 | uVar24 | uVar25 |
         (uint)*(ushort *)((long)pvVar9 + 0x72c) << 0xe;
    piVar14 = piVar8 + 0x6d20;
    init_scaling_function
              ((RK_U8 (*) [2])((long)pvVar9 + 0x699),*(RK_U8 *)((long)pvVar9 + 0x696),
               (RK_U8 *)piVar14);
    if (*(char *)((long)pvVar9 + 0x68e) == '\0') {
      init_scaling_function
                ((RK_U8 (*) [2])((long)pvVar9 + 0x6b5),*(RK_U8 *)((long)pvVar9 + 0x697),
                 (RK_U8 *)(piVar8 + 28000));
      init_scaling_function
                ((RK_U8 (*) [2])((long)pvVar9 + 0x6c9),*(RK_U8 *)((long)pvVar9 + 0x698),
                 (RK_U8 *)(piVar8 + 0x6da0));
    }
    else {
      memcpy(piVar8 + 28000,piVar14,0x100);
      memcpy(piVar8 + 0x6da0,piVar14,0x100);
    }
    lVar35 = 0;
    do {
      if (lVar35 != 0x18) {
        ar_coeffs_y[lVar35] = *(byte *)((long)pvVar9 + lVar35 + 0x6dd) - 0x80;
      }
      refs_selected[lVar35] = *(byte *)((long)pvVar9 + lVar35 + 0x6f5) - 0x80;
      *(uint *)(mf_types + lVar35 * 4) = *(byte *)((long)pvVar9 + lVar35 + 0x70e) - 0x80;
      lVar35 = lVar35 + 1;
    } while (lVar35 != 0x19);
    bVar41 = *(byte *)((long)pvVar9 + 0x68f);
    iVar44 = *(byte *)((long)pvVar9 + 0x690) + 6;
    uVar6 = *(ushort *)((long)pvVar9 + 0xe);
    bVar63 = (char)uVar6 - 8;
    uVar39 = 0x80 << (bVar63 & 0x1f);
    bVar42 = *(byte *)((long)pvVar9 + 0x691);
    iVar53 = -uVar39;
    iVar45 = ~uVar39 + (0x100 << (bVar63 & 0x1f));
    GenerateLumaGrainBlock
              ((RK_S32 (*) [82])ref_count,(uint)uVar6,*(RK_U8 *)((long)pvVar9 + 0x696),(uint)bVar42,
               (uint)bVar41,ar_coeffs_y,iVar44,iVar53,iVar45,*(RK_U16 *)((long)pvVar9 + 0x72c));
    GenerateChromaGrainBlock
              ((RK_S32 (*) [82])ref_count,(RK_S32 (*) [44])cur_offset,(RK_S32 (*) [44])local_1a58,
               (uint)uVar6,*(RK_U8 *)((long)pvVar9 + 0x696),*(RK_U8 *)((long)pvVar9 + 0x697),
               *(RK_U8 *)((long)pvVar9 + 0x698),(uint)bVar42,(uint)bVar41,refs_selected,
               (RK_S32 *)mf_types,iVar44,iVar53,iVar45,*(RK_U8 *)((long)pvVar9 + 0x68e),
               *(RK_U16 *)((long)pvVar9 + 0x72c));
    piVar21 = piVar8 + 0x6de0;
    puVar36 = local_865c;
    lVar35 = 0;
    do {
      lVar38 = 0;
      do {
        auVar90 = pshuflw(*(undefined1 (*) [16])(puVar36 + lVar38 * 4),
                          *(undefined1 (*) [16])(puVar36 + lVar38 * 4),0xe8);
        auVar90 = pshufhw(auVar90,auVar90,0xe8);
        *(ulong *)((long)piVar21 + lVar38 * 2) = CONCAT44(auVar90._8_4_,auVar90._0_4_);
        lVar38 = lVar38 + 4;
      } while (lVar38 != 0x40);
      lVar35 = lVar35 + 1;
      puVar36 = puVar36 + 0x148;
      piVar21 = piVar21 + 0x20;
    } while (lVar35 != 0x40);
    piVar21 = piVar8 + 0x75e0;
    puVar52 = local_1620;
    puVar36 = local_3040;
    lVar35 = 0;
    do {
      lVar38 = 0;
      do {
        psVar2 = (short *)(puVar36 + lVar38 * 4);
        psVar3 = (short *)(puVar52 + lVar38 * 4);
        auVar59._0_4_ = (int)psVar2[4];
        auVar59._4_4_ = (int)psVar3[4];
        auVar59._8_4_ = (int)psVar2[6];
        auVar59._12_4_ = (int)psVar3[6];
        auVar62._0_4_ = (int)*psVar2;
        auVar62._4_4_ = (int)*psVar3;
        auVar62._8_4_ = (int)psVar2[2];
        auVar62._12_4_ = (int)psVar3[2];
        auVar90 = packssdw(auVar62,auVar59);
        *(undefined1 (*) [16])(piVar21 + lVar38) = auVar90;
        lVar38 = lVar38 + 4;
      } while (lVar38 != 0x20);
      lVar35 = lVar35 + 1;
      puVar52 = puVar52 + 0xb0;
      puVar36 = puVar36 + 0xb0;
      piVar21 = piVar21 + 0x20;
    } while (lVar35 != 0x20);
    memcpy(pvVar20,piVar14,0x3300);
    mpp_buffer_sync_end_f(*(MppBuffer *)(piVar8 + 0x12),0,"vdpu_av1d_set_fgs");
    *(undefined4 *)(lVar34 + 0x178) = 0;
    iVar44 = mpp_buffer_get_fd_with_caller(*(MppBuffer *)(piVar8 + 0x12),"vdpu_av1d_set_fgs");
    *(int *)(lVar34 + 0x17c) = iVar44;
    if (((*(byte *)(lVar34 + 0x1c) & 0x80) != 0) && (((byte)hal_av1d_debug & 8) != 0)) {
      _mpp_log_l(4,"hal_av1d_vdpu","NOTICE: filmgrain enabled.\n",(char *)0x0);
    }
  }
  lVar34 = *(long *)((long)hal + 0x50);
  pvVar20 = mpp_buffer_get_ptr_with_caller(*(MppBuffer *)(lVar34 + 0x30),"vdpu_av1d_set_prob");
  lVar35 = *(long *)(lVar34 + 0x1e7a8);
  memcpy(pvVar20,*(void **)((long)pvVar9 + 0xc88),0x2fe0);
  if ((*(byte *)((long)pvVar9 + 0x528) & 0xfd) == 0) {
    memcpy((void *)((long)pvVar20 + 0x890),*(void **)((long)pvVar9 + 0xc90),0x8a);
  }
  mpp_buffer_sync_end_f(*(MppBuffer *)(lVar34 + 0x30),0,"vdpu_av1d_set_prob");
  iVar44 = mpp_buffer_get_fd_with_caller(*(MppBuffer *)(lVar34 + 0x38),"vdpu_av1d_set_prob");
  *(int *)(lVar35 + 0x2ac) = iVar44;
  iVar44 = mpp_buffer_get_fd_with_caller(*(MppBuffer *)(lVar34 + 0x30),"vdpu_av1d_set_prob");
  *(int *)(lVar35 + 0x2b4) = iVar44;
  bVar41 = *(byte *)((long)piVar8 + 0x1e783);
  lVar34 = *(long *)(piVar8 + 0x79ea);
  uVar11 = (uint)*(ushort *)((long)pvVar9 + 0x20);
  uVar6 = *(ushort *)((long)pvVar9 + 0x1c);
  uVar33 = uVar11 % (uint)uVar6;
  uVar23 = (uint)((short)uVar33 == 0) << 0xb;
  uVar39 = *(uint *)(lVar34 + 0x2c);
  *(uint *)(lVar34 + 0x2c) = uVar39 & 0xfffff7ff | uVar23;
  if (bVar41 != 0) {
    uVar11 = *(ushort *)((long)pvVar9 + 0x1e) * uVar33 + uVar11 / uVar6;
  }
  uVar33 = 2;
  if (*(ushort *)((long)pvVar9 + 0x1c) < 2) {
    uVar33 = (uint)(1 < *(ushort *)((long)pvVar9 + 0x1e)) * 2;
  }
  uVar43 = *(uint *)(lVar34 + 0x28);
  *(uint *)(lVar34 + 0x28) = uVar43 & 0xfffffffd | uVar33;
  uVar24 = (*(ushort *)((long)pvVar9 + 0x1c) & 0x7f) << 0x11;
  *(uint *)(lVar34 + 0x28) = uVar43 & 0xff01fffd | uVar33 | uVar24;
  uVar6 = *(ushort *)((long)pvVar9 + 0x1e);
  *(uint *)(lVar34 + 0x24) = *(uint *)(lVar34 + 0x24) & 0xfffff | uVar11 << 0x14;
  *(uint *)(lVar34 + 0x28) =
       bVar41 & 1 | uVar43 & 0xff0003fc | uVar33 | uVar24 | (uVar6 & 0x7f) << 10;
  *(uint *)(lVar34 + 0x2c) = uVar39 & 0x3ffff7ff | uVar23 | *(int *)((long)pvVar9 + 0x524) << 0x1e;
  if ((uVar33 != 0) && (((byte)hal_av1d_debug & 8) != 0)) {
    _mpp_log_l(4,"hal_av1d_vdpu","NOTICE: tile enabled.\n",(char *)0x0);
  }
  iVar44 = mpp_buffer_get_fd_with_caller
                     (*(MppBuffer *)(piVar8 + 0x10),"vdpu_av1d_set_tile_info_regs");
  pvVar20 = local_9350;
  pHVar19 = local_9358;
  *(int *)(lVar34 + 0x29c) = iVar44;
  *(undefined4 *)(lVar34 + 0x298) = 0;
  uVar39 = *(uint *)((long)local_9350 + 0x1c);
  uVar33 = (*(byte *)((long)pvVar9 + 0x52d) & 1) << 0x1e;
  *(uint *)((long)local_9350 + 0x1c) = uVar39 & 0xbfffffff | uVar33;
  uVar11 = (*(byte *)((long)pvVar9 + 0x693) & 1) << 0xc;
  *(uint *)((long)local_9350 + 0x1c) = uVar39 & 0xbfffefff | uVar33 | uVar11;
  uVar39 = (uVar39 & 0xbfffeff9 | uVar33 | uVar11) + (*(byte *)((long)pvVar9 + 0x54d) & 3) * 2;
  *(uint *)((long)local_9350 + 0x1c) = uVar39;
  *(uint *)((long)local_9350 + 0x1c) = uVar39 & 0xfffffffe | *(byte *)((long)pvVar9 + 0x54c) & 1;
  uVar33 = (uint)(*(char *)((long)pvVar9 + 0x528) == '\0') << 0x10;
  uVar39 = *(uint *)((long)local_9350 + 0x20);
  *(uint *)((long)local_9350 + 0x20) = uVar39 & 0xfffeffff | uVar33;
  uVar11 = (uint)*(byte *)((long)pvVar9 + 0x54e) << 8;
  *(uint *)((long)local_9350 + 0x20) = uVar39 & 0xfffe00ff | uVar33 | uVar11;
  uVar23 = (*(ushort *)((long)pvVar9 + 0xe) & 3) << 6;
  *(uint *)((long)local_9350 + 0x20) = uVar39 & 0xfffe003f | uVar33 | uVar11 | uVar23;
  *(uint *)((long)local_9350 + 0x20) =
       uVar39 & 0xfffe000f | uVar33 | uVar11 | uVar23 | (*(ushort *)((long)pvVar9 + 0xe) & 3) << 4;
  uVar11 = (*(byte *)((long)pvVar9 + 0xc64) & 7) << 8;
  uVar39 = *(uint *)((long)local_9350 + 0x2c);
  *(uint *)((long)local_9350 + 0x2c) = uVar39 & 0xfffff8ff | uVar11;
  uVar23 = *(uint *)((long)pvVar9 + 0x14) >> 0x13 & 0x80;
  *(uint *)((long)local_9350 + 0x2c) = uVar39 & 0xfffff87f | uVar11 | uVar23;
  uVar43 = *(uint *)((long)pvVar9 + 0x14) >> 0x1a & 0xffffffe0;
  *(uint *)((long)local_9350 + 0x2c) = uVar39 & 0xfffff84f | uVar11 | uVar23 | uVar43;
  uVar24 = (uint)((ulong)*(undefined8 *)((long)pvVar9 + 0x14) >> 0x23);
  uVar33 = uVar24 * 0x8000000 + 0x10000000 & 0x38000000;
  if ((uVar24 & 7) == 0) {
    uVar33 = 0;
  }
  *(uint *)((long)local_9350 + 0x2c) = uVar39 & 0xc7fff84f | uVar11 | uVar23 | uVar43 | uVar33;
  *(uint *)((long)local_9350 + 0x30) =
       (*(ushort *)((long)pvVar9 + 0x14) >> 2 & 0x400) +
       (*(uint *)((long)local_9350 + 0x30) & 0xfff803ff) + 0x7800;
  uVar39 = *(uint *)((long)local_9350 + 0x34);
  *(uint *)((long)local_9350 + 0x34) = uVar39 & 0xfffffe07;
  *(uint *)((long)local_9350 + 0x38) = *(uint *)((long)local_9350 + 0x38) & 0xffffc0ff;
  *(uint *)((long)local_9350 + 0x3c) = *(uint *)((long)local_9350 + 0x3c) & 0xffffc0ff;
  *(uint *)((long)local_9350 + 0x40) = *(uint *)((long)local_9350 + 0x40) & 0xffffc0ff;
  *(uint *)((long)local_9350 + 0x44) = *(uint *)((long)local_9350 + 0x44) & 0xffffc0ff;
  *(ulong *)((long)local_9350 + 0x48) = *(ulong *)((long)local_9350 + 0x48) & 0xffffc0ffffffc0ff;
  uVar33 = *(uint *)((long)local_9350 + 0x7c);
  *(uint *)((long)local_9350 + 0x7c) = uVar33 & 0xffffc0ff;
  uVar11 = *(uint *)((long)local_9350 + 0x80);
  *(uint *)((long)local_9350 + 0x80) = uVar11 & 0xffffc0ff;
  uVar23 = (uint)*(byte *)((long)pvVar9 + 0x54f) << 0x19;
  *(uint *)((long)local_9350 + 0x34) = uVar39 & 0x1fffe07 | uVar23;
  uVar43 = (*(byte *)((long)pvVar9 + 0x550) & 0x7f) << 0x12;
  *(uint *)((long)local_9350 + 0x34) = uVar39 & 0x3fe07 | uVar23 | uVar43;
  uVar24 = (*(byte *)((long)pvVar9 + 0x552) & 0x7f) << 0xb;
  *(uint *)((long)local_9350 + 0x34) = uVar39 & 0x607 | uVar23 | uVar43 | uVar24;
  *(uint *)((long)local_9350 + 0xbc) =
       *(uint *)((long)local_9350 + 0xbc) & 0x87ffffff |
       (*(byte *)((long)pvVar9 + 0x555) & 0xf) << 0x1b;
  *(uint *)((long)local_9350 + 0xc0) =
       *(uint *)((long)local_9350 + 0xc0) & 0x87ffffff |
       (*(byte *)((long)pvVar9 + 0x556) & 0xf) << 0x1b;
  *(uint *)((long)local_9350 + 0xc4) =
       *(uint *)((long)local_9350 + 0xc4) & 0xfffc3fff |
       (*(byte *)((long)pvVar9 + 0x557) & 0xf) << 0xe;
  *(uint *)((long)local_9350 + 0x34) =
       uVar39 & 0x407 | uVar23 | uVar43 | uVar24 | (*(byte *)((long)pvVar9 + 0xc5c) & 1) << 9;
  *(uint *)((long)local_9350 + 0x70) =
       *(uint *)((long)local_9350 + 0x70) & 0x1ffffff |
       (uint)*(byte *)((long)pvVar9 + 0x551) << 0x19;
  *(uint *)((long)local_9350 + 0x74) =
       *(uint *)((long)local_9350 + 0x74) & 0x1ffffff |
       (uint)*(byte *)((long)pvVar9 + 0x553) << 0x19;
  uVar39 = (*(byte *)((long)pvVar9 + 0xc84) & 0xf) << 0x1a;
  if (*(byte *)((long)pvVar9 + 0xc84) == 0) {
    uVar39 = 0x4000000;
  }
  *(uint *)((long)local_9350 + 0x7c) = uVar33 & 0xc3ffc0ff | uVar39;
  uVar39 = (*(byte *)((long)pvVar9 + 0xc85) & 0xf) << 0x1a;
  if (*(byte *)((long)pvVar9 + 0xc85) == 0) {
    uVar39 = 0x4000000;
  }
  *(uint *)((long)local_9350 + 0x80) = uVar11 & 0xc3ffc0ff | uVar39;
  uVar39 = piVar8[0x6d1e];
  uVar33 = *(uint *)((long)pvVar9 + 0xc7c) & 0xfffffff0;
  iVar44 = mpp_buffer_get_fd_with_caller(*local_9358->buf,"vdpu_av1d_gen_regs");
  *(int *)((long)pvVar20 + 0x104) = iVar44;
  iVar44 = mpp_buffer_get_fd_with_caller(*pHVar19->buf,"vdpu_av1d_gen_regs");
  *(int *)((long)pvVar20 + 0x18c) = iVar44;
  mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 0x48),99,uVar39);
  iVar44 = mpp_buffer_get_fd_with_caller(*pHVar19->buf,"vdpu_av1d_gen_regs");
  *(int *)((long)pvVar20 + 0x214) = iVar44;
  mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 0x48),0x85,(uVar39 >> 1) + uVar39 + 0x40);
  *(uint *)((long)pvVar20 + 0x408) = *(int *)((long)hal + 0x10) + 0x7fU & 0xffffff80;
  *(uint *)((long)pvVar20 + 0x14) =
       *(uint *)((long)pvVar20 + 0x14) & 0x1ffffff | *(int *)((long)pvVar9 + 0xc7c) << 0x1c;
  *(uint *)((long)pvVar20 + 0x18) = *(int *)((long)hal + 0x10) + 0x7fU & 0xffffff80;
  *(undefined4 *)((long)pvVar20 + 0x40c) = 0;
  *(undefined4 *)((long)pvVar20 + 0x2a0) = 0;
  iVar44 = mpp_buffer_get_fd_with_caller(streambuf,"vdpu_av1d_gen_regs");
  *(int *)((long)pvVar20 + 0x2a4) = iVar44;
  mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 0x48),0xa9,uVar33);
  if ((((((byte)hal_av1d_debug & 8) != 0) &&
       (_mpp_log_l(4,"hal_av1d_vdpu","stream len %d\n",(char *)0x0,
                   (ulong)*(uint *)((long)hal + 0x10)), ((byte)hal_av1d_debug & 8) != 0)) &&
      (_mpp_log_l(4,"hal_av1d_vdpu","stream offset %d\n",(char *)0x0,(ulong)uVar33),
      ((byte)hal_av1d_debug & 8) != 0)) &&
     (_mpp_log_l(4,"hal_av1d_vdpu","stream tag_size %d\n",(char *)0x0,
                 (ulong)*(uint *)((long)pvVar9 + 0xc7c)), ((byte)hal_av1d_debug & 8) != 0)) {
    _mpp_log_l(4,"hal_av1d_vdpu","stream start_bit %d\n",(char *)0x0,
               (ulong)(*(uint *)((long)pvVar20 + 0x14) >> 0x19));
  }
  *(undefined2 *)((long)pvVar20 + 0x4e8) = 0x40;
  iVar44 = mpp_buffer_get_fd_with_caller(*(MppBuffer *)(piVar8 + 0x18),"vdpu_av1d_gen_regs");
  *(int *)((long)pvVar20 + 700) = iVar44;
  iVar44 = mpp_buffer_get_fd_with_caller(*(MppBuffer *)(piVar8 + 0x18),"vdpu_av1d_gen_regs");
  *(int *)((long)pvVar20 + 0x2c4) = iVar44;
  *(uint *)((long)pvVar20 + 0xdc) = *(uint *)((long)pvVar20 + 0xdc) & 0x7fff0000 | 8;
  uVar33 = *(uint *)((long)pvVar20 + 0xe8) & 0xfffff800;
  *(uint *)((long)pvVar20 + 0xe8) = uVar33 + 0x210;
  *(byte *)((long)pvVar20 + 0x42b) = *(byte *)((long)pvVar20 + 0x42b) & 0xbf;
  *(uint *)((long)pvVar20 + 0x424) = *(uint *)((long)pvVar20 + 0x424) & 0xf00000ff | 0x1004000;
  *(undefined8 *)((long)pvVar20 + 0x4f8) = 0x8fffffff8fffffff;
  uVar39 = *(uint *)((long)pvVar20 + 0x500);
  *(uint *)((long)pvVar20 + 0x500) = uVar39 | 1;
  *(byte *)((long)pvVar20 + 0x50b) = *(byte *)((long)pvVar20 + 0x50b) & 7;
  *(undefined2 *)((long)pvVar20 + 0x62a) = 0x101;
  uVar11 = (uint)local_9370;
  *(uint *)((long)pvVar20 + 0x52c) = (uVar11 & 0xfffe) << 0xf | local_9374 >> 1;
  *(uint *)((long)pvVar20 + 0x530) = uVar11 << 0x10 | local_9374;
  *(RK_U32 *)((long)pvVar20 + 0x524) = local_9378 << 0x10 | local_9378 & 0xffff;
  if (*(char *)((long)piVar8 + 0x1e781) == '\0') {
    RVar46 = local_937c * local_9378;
    MVar13 = mpp_frame_get_fmt(mframe);
    uVar39 = 0xc0000;
    if ((MVar13 & 0xfffff) != MPP_FMT_YUV420SP) {
      uVar39 = 0;
    }
    *(uint *)((long)pvVar20 + 0x508) = *(uint *)((long)pvVar20 + 0x508) & 0xff83ffff | uVar39;
    iVar44 = mpp_buffer_get_fd_with_caller(buffer,"vdpu_av1d_gen_regs");
    *(int *)((long)pvVar20 + 0x518) = iVar44;
    iVar44 = mpp_buffer_get_fd_with_caller(buffer,"vdpu_av1d_gen_regs");
    *(int *)((long)pvVar20 + 0x520) = iVar44;
    mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 0x48),0x148,RVar46);
  }
  else {
    RVar46 = 8;
    if ((((*(ushort *)((long)pvVar20 + 0x15) & 0x240) == 0) &&
        (*(uint *)((long)pvVar20 + 0x38) < 0x4000000)) &&
       (*(uint *)((long)pvVar20 + 0x3c) < 0x4000000)) {
      RVar46 = (uint)(0x3ffffff < *(uint *)((long)pvVar20 + 0x48)) << 3;
    }
    uVar23 = uVar11;
    if (8 < *(ushort *)((long)pvVar9 + 0xe)) {
      uVar23 = uVar11 * 2;
    }
    *(RK_U32 *)((long)pvVar20 + 0x524) = local_9378 & 0xffff | uVar23 << 0x10;
    uVar43 = uVar11 * 2;
    if (*(ushort *)((long)pvVar9 + 0xe) < 9) {
      uVar43 = uVar11;
    }
    *(uint *)((long)pvVar20 + 0x524) = uVar43 & 0xffff | uVar23 << 0x10;
    *(uint *)((long)pvVar20 + 0xe8) = uVar33 | 0x6210;
    *(uint *)((long)pvVar20 + 0x500) = uVar39 | 9;
    uVar39 = uVar11 * -0x10000000;
    if ((local_9370 & 0xf) == 0) {
      uVar39 = uVar11 & 0xf;
    }
    uVar23 = local_9374 + RVar46;
    uVar11 = uVar23 & 0xf;
    uVar33 = 0x10 - uVar11;
    if (uVar11 == 0) {
      uVar33 = 0;
    }
    *(uint *)((long)pvVar20 + 0x504) = *(uint *)((long)pvVar20 + 0x504) & 0xfffff9ff | 0x400;
    *(uint *)((long)pvVar20 + 0x7dc) =
         (uVar33 & 0xf) << 0x18 | RVar46 << 0x10 | (uint)*(ushort *)((long)pvVar20 + 0x7dc) | uVar39
    ;
    mpp_frame_set_offset_y(mframe,RVar46);
    mpp_frame_set_ver_stride(mframe,uVar33 + uVar23);
    *(byte *)((long)pvVar20 + 0x50a) = *(byte *)((long)pvVar20 + 0x50a) & 0x83;
    iVar44 = mpp_buffer_get_fd_with_caller(buffer,"vdpu_av1d_gen_regs");
    *(int *)((long)pvVar20 + 0x518) = iVar44;
    iVar44 = mpp_buffer_get_fd_with_caller(buffer,"vdpu_av1d_gen_regs");
    *(int *)((long)pvVar20 + 0x520) = iVar44;
    iVar44 = mpp_buffer_get_fd_with_caller(buffer,"vdpu_av1d_gen_regs");
    *(int *)((long)pvVar20 + 0x7e4) = iVar44;
  }
  return MPP_OK;
}

Assistant:

MPP_RET vdpu_av1d_gen_regs(void *hal, HalTaskInfo *task)
{
    MPP_RET ret = MPP_ERR_UNKNOW;
    Av1dHalCtx *p_hal = (Av1dHalCtx *)hal;
    VdpuAv1dRegCtx *ctx = (VdpuAv1dRegCtx *)p_hal->reg_ctx;
    VdpuAv1dRegSet *regs;
    DXVA_PicParams_AV1 *dxva = (DXVA_PicParams_AV1*)task->dec.syntax.data;
    MppFrame mframe;
    MppBuffer buffer = NULL;
    MppBuffer streambuf = NULL;
    RK_U32 height = dxva->height;
    RK_U32 width = dxva->width;
    RK_U32 hor_stride;
    RK_U32 ver_stride;
    HalBuf *tile_out_buf;
    RK_U32 num_tile_cols = 1 << dxva->tile_cols_log2;

    INP_CHECK(ret, NULL == p_hal);

    ctx->refresh_frame_flags = dxva->refresh_frame_flags;

    if (task->dec.flags.parse_err ||
        task->dec.flags.ref_err) {
        mpp_err_f("parse err %d ref err %d\n",
                  task->dec.flags.parse_err, task->dec.flags.ref_err);
        goto __RETURN;
    }

    if (p_hal->fast_mode) {
        RK_U32 i = 0;

        for (i = 0; i <  MPP_ARRAY_ELEMS(ctx->reg_buf); i++) {
            if (!ctx->reg_buf[i].valid) {
                task->dec.reg_index = i;
                ctx->regs = ctx->reg_buf[i].regs;
                ctx->reg_buf[i].valid = 1;
                break;
            }
        }
    }

    regs = ctx->regs;
    memset(regs, 0, sizeof(*regs));

    vdpu_av1d_setup_tile_bufs(p_hal, dxva);

    if (!ctx->filter_mem || height > ctx->height || num_tile_cols > ctx->num_tile_cols) {
        if (ctx->filter_mem)
            vdpu_av1d_filtermem_release(ctx);
        ret = vdpu_av1d_filtermem_alloc(p_hal, ctx, dxva);
        if (!ret) {
            mpp_err("filt buffer get fail\n");
            vdpu_av1d_filtermem_release(ctx);
        }
    }

    ctx->width = width;
    ctx->height = height;
    ctx->num_tile_cols = num_tile_cols;
    mpp_buf_slot_get_prop(p_hal->slots, task->dec.output, SLOT_FRAME_PTR, &mframe);
    mpp_buf_slot_get_prop(p_hal ->slots, task->dec.output, SLOT_BUFFER, &buffer);
    mpp_buf_slot_get_prop(p_hal ->packet_slots, task->dec.input, SLOT_BUFFER, &streambuf);
    tile_out_buf = hal_bufs_get_buf(ctx->tile_out_bufs, task->dec.output);
    hor_stride = mpp_frame_get_hor_stride(mframe);
    ver_stride = mpp_frame_get_ver_stride(mframe);

    ctx->ver_stride = ver_stride;

    p_hal->strm_len = (RK_S32)mpp_packet_get_length(task->dec.input_packet);

    ctx->fbc_en = !!MPP_FRAME_FMT_IS_FBC(mpp_frame_get_fmt(mframe));

    AV1D_DBG(AV1D_DBG_LOG, "bitdepth %d fmt %d [%d : %d] wxh [%d : %d] uxv [%d : %d]\n",
             dxva->bitdepth, mpp_frame_get_fmt(mframe),
             dxva->format.subsampling_x, dxva->format.subsampling_y,
             ctx->width, ctx->height,
             ctx->hor_stride, ctx->ver_stride);

    regs->swreg1.sw_dec_abort_e     = 0;
    regs->swreg1.sw_dec_e           = 1;
    regs->swreg1.sw_dec_tile_int_e  = 0;
    regs->swreg2.sw_dec_clk_gate_e = 1;

    regs->swreg3.sw_dec_mode           = 17; // av1 mode
    regs->swreg3.sw_skip_mode          = dxva->coding.skip_mode;
    regs->swreg3.sw_dec_out_ec_byte_word = 0; // word align
    regs->swreg3.sw_write_mvs_e        = 1;
    regs->swreg3.sw_dec_out_ec_bypass  = 1;

    regs->swreg5.sw_tempor_mvp_e        = dxva->coding.use_ref_frame_mvs;
    regs->swreg5.sw_delta_lf_res_log    = dxva->loop_filter.delta_lf_res;
    regs->swreg5.sw_delta_lf_multi      = dxva->loop_filter.delta_lf_multi;
    regs->swreg5.sw_delta_lf_present    = dxva->loop_filter.delta_lf_present;
    regs->swreg5.sw_disable_cdf_update  = dxva->coding.disable_cdf_update;
    regs->swreg5.sw_allow_warp          = dxva->coding.warped_motion;
    regs->swreg5.sw_show_frame          = dxva->format.show_frame;
    regs->swreg5.sw_switchable_motion_mode  = dxva->coding.switchable_motion_mode;
    regs->swreg5.sw_enable_cdef         = !(dxva->cdef.bits == 0 && dxva->cdef.damping == 0 &&
                                            dxva->cdef.y_strengths[0].primary == 0 &&
                                            dxva->cdef.y_strengths[0].secondary == 0 &&
                                            dxva->cdef.uv_strengths[0].primary == 0 &&
                                            dxva->cdef.uv_strengths[0].secondary == 0);
    regs->swreg5.sw_allow_masked_compound   = dxva->coding.masked_compound;
    regs->swreg5.sw_allow_interintra    = dxva->coding.interintra_compound;
    regs->swreg5.sw_enable_intra_edge_filter = dxva->coding.intra_edge_filter;
    regs->swreg5.sw_allow_filter_intra  = dxva->coding.filter_intra;
    regs->swreg5.sw_enable_jnt_comp     = dxva->coding.jnt_comp;
    regs->swreg5.sw_enable_dual_filter  = dxva->coding.dual_filter;
    regs->swreg5.sw_reduced_tx_set_used = dxva->coding.reduced_tx_set;
    regs->swreg5.sw_allow_screen_content_tools = dxva->coding.screen_content_tools;
    regs->swreg5.sw_allow_intrabc       = dxva->coding.intrabc;

    regs->swreg5.sw_force_interger_mv   = dxva->coding.integer_mv;

    vdpu_av1d_set_global_model(p_hal, dxva);
    vdpu_av1d_set_tile_info_mem(p_hal, dxva);

    if ((dxva->format.frame_type && (dxva->format.frame_type != AV1_FRAME_INTRA_ONLY))
        || dxva->coding.intrabc) {
        vdpu_av1d_set_reference_frames(p_hal, ctx, dxva);
    }
    vdpu_av1d_set_segmentation(ctx, dxva);
    vdpu_av1d_set_loopfilter(p_hal, dxva);
    vdpu_av1d_set_picture_dimensions(p_hal, dxva);
    vdpu_av1d_set_cdef(p_hal, dxva);
    vdpu_av1d_set_lr(p_hal, dxva);
    vdpu_av1d_set_fgs(ctx, dxva);
    vdpu_av1d_set_prob(p_hal, dxva);
    vdpu_av1d_set_tile_info_regs(ctx, dxva);

#if DUMP_AV1_DATAS/* dump buffer */
    {
        char name[128];
        char *path = "/data/video";
        static int g_frame_num = 0;
        FILE *fp;
        RK_U32 i;
        RK_U32 *data;
        RK_U32 size;

        data = mpp_buffer_get_ptr(ctx->global_model);
        size = MPP_ALIGN(GLOBAL_MODEL_SIZE, 2048);
        memset(name, 0, sizeof(name));
        sprintf(name, "%s/global_mode_%d.txt", path, g_frame_num);
        fp = fopen(name, "wb");
        for ( i = 0; i < size / 4; i++)
            fprintf(fp, "%08x\n", data[i]);
        fflush(fp);
        fclose(fp);

        data = mpp_buffer_get_ptr(ctx->tile_info);
        size = AV1_TILE_INFO_SIZE;
        memset(name, 0, sizeof(name));
        sprintf(name, "%s/tile_info_%d.txt", path, g_frame_num);
        fp = fopen(name, "wb");
        for ( i = 0; i < size / 4; i++)
            fprintf(fp, "%08x\n", data[i]);
        fflush(fp);
        fclose(fp);

        data = mpp_buffer_get_ptr(streambuf);
        size = MPP_ALIGN(p_hal->strm_len, 1);
        memset(name, 0, sizeof(name));
        sprintf(name, "%s/stream_%d.txt", path, g_frame_num);
        fp = fopen(name, "wb");
        fwrite((RK_U8*)data, 1, size, fp);
        fflush(fp);
        fclose(fp);

        data = mpp_buffer_get_ptr(ctx->film_grain_mem);
        size = MPP_ALIGN(sizeof(AV1FilmGrainMemory), 2048);
        memset(name, 0, sizeof(name));
        sprintf(name, "%s/film_grain_mem_%d.txt", path, g_frame_num);
        fp = fopen(name, "wb");
        for ( i = 0; i < size / 4; i++)
            fprintf(fp, "%08x\n", data[i]);
        fflush(fp);
        fclose(fp);

        data = mpp_buffer_get_ptr(ctx->prob_tbl_base);
        size = MPP_ALIGN(sizeof(AV1CDFs), 2048);
        memset(name, 0, sizeof(name));
        sprintf(name, "%s/prob_tbl_%d.txt", path, g_frame_num);
        fp = fopen(name, "wb");
        for ( i = 0; i < size / 4; i++)
            fprintf(fp, "%08x\n", data[i]);
        fflush(fp);
        fclose(fp);

        data = mpp_buffer_get_ptr(ctx->prob_tbl_out_base);
        size = MPP_ALIGN(sizeof(AV1CDFs), 2048);
        memset(name, 0, sizeof(name));
        sprintf(name, "%s/prob_tbl_out_%d.txt", path, g_frame_num);
        fp = fopen(name, "wb");
        for ( i = 0; i < size / 4; i++)
            fprintf(fp, "%08x\n", data[i]);
        fflush(fp);
        fclose(fp);

        g_frame_num ++;
    }
#endif

    regs->swreg7.sw_blackwhite_e    = dxva->format.mono_chrome;
    regs->swreg7.sw_clip_to_restricted_range  = dxva->film_grain.clip_to_restricted_range;
    regs->swreg7.sw_delta_q_res_log     = dxva->quantization.delta_q_res;
    regs->swreg7.sw_delta_q_present     = dxva->quantization.delta_q_present;

    regs->swreg8.sw_idr_pic_e           = !dxva->format.frame_type;
    regs->swreg8.sw_quant_base_qindex   = dxva->quantization.base_qindex;
    regs->swreg8.sw_bit_depth_y_minus8  = dxva->bitdepth - 8;
    regs->swreg8.sw_bit_depth_c_minus8  = dxva->bitdepth - 8;

    regs->swreg11.sw_mcomp_filt_type    = dxva->interp_filter;
    regs->swreg11.sw_high_prec_mv_e     = dxva->coding.high_precision_mv;
    regs->swreg11.sw_comp_pred_mode     = dxva->coding.reference_mode ? 2 : 0;
    regs->swreg11.sw_transform_mode     = dxva->coding.tx_mode ? (dxva->coding.tx_mode + 2) : 0;
    regs->swreg12.sw_max_cb_size        = dxva->coding.use_128x128_superblock ? 7 : 6;;
    regs->swreg12.sw_min_cb_size        = 3;

    /* unused in comdel */
    regs->swreg12.sw_av1_comp_pred_fixed_ref    = 0;
    regs->swreg13.sw_comp_pred_var_ref0_av1     = 0;
    regs->swreg13.sw_comp_pred_var_ref1_av1     = 0;
    regs->swreg14.sw_filt_level_seg0            = 0;
    regs->swreg15.sw_filt_level_seg1            = 0;
    regs->swreg16.sw_filt_level_seg2            = 0;
    regs->swreg17.sw_filt_level_seg3            = 0;
    regs->swreg18.sw_filt_level_seg4            = 0;
    regs->swreg19.sw_filt_level_seg5            = 0;
    regs->swreg31.sw_filt_level_seg6            = 0;
    regs->swreg32.sw_filt_level_seg7            = 0;


    regs->swreg13.sw_qp_delta_y_dc_av1          = dxva->quantization.y_dc_delta_q;
    regs->swreg13.sw_qp_delta_ch_dc_av1         = dxva->quantization.u_dc_delta_q;
    regs->swreg13.sw_qp_delta_ch_ac_av1         = dxva->quantization.u_ac_delta_q;
    regs->swreg47.sw_qmlevel_y                  = dxva->quantization.qm_y;
    regs->swreg48.sw_qmlevel_u                  = dxva->quantization.qm_u;
    regs->swreg49.sw_qmlevel_v                  = dxva->quantization.qm_v;

    regs->swreg13.sw_lossless_e                 = dxva->coded_lossless;
    regs->swreg28.sw_quant_delta_v_dc           = dxva->quantization.v_dc_delta_q;
    regs->swreg29.sw_quant_delta_v_ac           = dxva->quantization.v_ac_delta_q;

    regs->swreg31.sw_skip_ref0              = dxva->skip_ref0 ? dxva->skip_ref0 : 1;
    regs->swreg32.sw_skip_ref1              = dxva->skip_ref1 ? dxva->skip_ref1 : 1;

    /*input out put buf cfg*/
    {
        // RK_U32 out_w = MPP_ALIGN(4 * width * bit_depth, 128) / 8;
        // RK_U32 out_h = height / 4;
        // RK_U32 y_stride = out_w * out_h;
        // RK_U32 uv_stride = y_stride / 2;

        RK_U32 y_stride = ctx->luma_size;
        RK_U32 uv_stride = y_stride / 2;
        RK_U32 mv_offset = y_stride + uv_stride + 64;
        RK_U32 offset = (dxva->frame_tag_size & (~0xf));

        regs->addr_cfg.swreg65.sw_dec_out_ybase_lsb = mpp_buffer_get_fd(tile_out_buf->buf[0]);//mpp_buffer_get_fd(buffer);
        regs->addr_cfg.swreg99.sw_dec_out_cbase_lsb = mpp_buffer_get_fd(tile_out_buf->buf[0]);
        mpp_dev_set_reg_offset(p_hal->dev, 99, y_stride);
        regs->addr_cfg.swreg133.sw_dec_out_dbase_lsb = mpp_buffer_get_fd(tile_out_buf->buf[0]);
        mpp_dev_set_reg_offset(p_hal->dev, 133, mv_offset);

        /*  if (ctx->fbc_en) {
              regs->swreg190.sw_dec_out_tybase_lsb = 0;// TODO:
              regs->swreg224.sw_dec_out_tcbase_lsb = 0;// TODO:
          }*/

        regs->swreg258.sw_strm_buffer_len = MPP_ALIGN(p_hal->strm_len, 128);//
        regs->swreg5.sw_strm_start_bit    =  (dxva->frame_tag_size & 0xf) * 8; // bit start to decode
        regs->swreg6.sw_stream_len  = MPP_ALIGN(p_hal->strm_len, 128);//p_hal->strm_len - offset;
        regs->swreg259.sw_strm_start_offset = 0;
        regs->addr_cfg.swreg168.sw_stream_base_msb = 0;
        regs->addr_cfg.swreg169.sw_stream_base_lsb = mpp_buffer_get_fd(streambuf);
        mpp_dev_set_reg_offset(p_hal->dev, 169, offset);

        AV1D_DBG(AV1D_DBG_LOG, "stream len %d\n", p_hal->strm_len);
        AV1D_DBG(AV1D_DBG_LOG, "stream offset %d\n", offset);
        AV1D_DBG(AV1D_DBG_LOG, "stream tag_size %d\n", dxva->frame_tag_size);
        AV1D_DBG(AV1D_DBG_LOG, "stream start_bit %d\n", regs->swreg5.sw_strm_start_bit);
    }
    regs->swreg314.sw_dec_alignment = 64;

    regs->addr_cfg.swreg175.sw_mc_sync_curr_base_lsb = mpp_buffer_get_fd(ctx->tile_buf);
    regs->addr_cfg.swreg177.sw_mc_sync_left_base_lsb = mpp_buffer_get_fd(ctx->tile_buf);

    regs->swreg55.sw_apf_disable = 0;
    regs->swreg55.sw_apf_threshold = 8;
    regs->swreg58.sw_dec_buswidth = 2;
    regs->swreg58.sw_dec_max_burst = 16;
    regs->swreg266.sw_error_conceal_e                     = 0;
    regs->swreg265.sw_axi_rd_ostd_threshold               = 64;
    regs->swreg265.sw_axi_wr_ostd_threshold               = 64;

    regs->swreg318.sw_ext_timeout_cycles                  = 0xfffffff;
    regs->swreg318.sw_ext_timeout_override_e              = 1;
    regs->swreg319.sw_timeout_cycles                      = 0xfffffff;
    regs->swreg319.sw_timeout_override_e                  = 1;

    /* pp cfg */
    regs->vdpu_av1d_pp_cfg.swreg320.sw_pp_out_e = 1;
    regs->vdpu_av1d_pp_cfg.swreg322.sw_pp_in_format = 0;
    regs->vdpu_av1d_pp_cfg.swreg394.sw_pp0_dup_hor = 1;
    regs->vdpu_av1d_pp_cfg.swreg394.sw_pp0_dup_ver = 1;
    regs->vdpu_av1d_pp_cfg.swreg331.sw_pp_in_height = height / 2;
    regs->vdpu_av1d_pp_cfg.swreg331.sw_pp_in_width = width / 2;
    regs->vdpu_av1d_pp_cfg.swreg332.sw_pp_out_height = height;
    regs->vdpu_av1d_pp_cfg.swreg332.sw_pp_out_width = width;
    regs->vdpu_av1d_pp_cfg.swreg329.sw_pp_out_y_stride = hor_stride;
    regs->vdpu_av1d_pp_cfg.swreg329.sw_pp_out_c_stride = hor_stride;

    // regs->vdpu_av1d_pp_cfg.swreg337.sw_pp_in_y_stride = hor_stride;
    // regs->vdpu_av1d_pp_cfg.swreg337.sw_pp_in_c_stride = hor_stride;
    if (ctx->fbc_en) {
        RK_U32 vir_left = 0, vir_right = 0, vir_top = 0, vir_bottom = 0;
        RK_U32 bypass_filter = !regs->swreg5.sw_superres_is_scaled &&
                               !regs->swreg5.sw_enable_cdef &&
                               !regs->swreg14.sw_filt_level0 &&
                               !regs->swreg15.sw_filt_level1 &&
                               !regs->swreg18.sw_lr_type;

        regs->vdpu_av1d_pp_cfg.swreg329.sw_pp_out_y_stride = dxva->bitdepth > 8 ?
                                                             width * 2 : width;
        regs->vdpu_av1d_pp_cfg.swreg329.sw_pp_out_c_stride = dxva->bitdepth > 8 ?
                                                             width * 2 : width;
        regs->swreg58.sw_dec_axi_wd_id_e = 1;
        regs->swreg58.sw_dec_axi_rd_id_e = 1;
        regs->vdpu_av1d_pp_cfg.swreg320.sw_pp_out_tile_e = 1;
        regs->vdpu_av1d_pp_cfg.swreg321.sw_pp_tile_size = 2;

        vir_left = 0;
        if (((vir_left + width) % 16))
            vir_right = 16 - ((vir_left + width) % 16);
        else
            vir_right = 0;

        if (!bypass_filter)
            vir_top = 8;
        else
            vir_top = 0;

        if (((vir_top + height) % 16))
            vir_bottom = 16 - ((vir_top + height) % 16);
        else
            vir_bottom = 0;

        regs->vdpu_av1d_pp_cfg.swreg503.sw_pp0_virtual_top = vir_top;
        regs->vdpu_av1d_pp_cfg.swreg503.sw_pp0_virtual_left = vir_left;
        regs->vdpu_av1d_pp_cfg.swreg503.sw_pp0_virtual_bottom = vir_bottom;
        regs->vdpu_av1d_pp_cfg.swreg503.sw_pp0_virtual_right = vir_right;
        mpp_frame_set_offset_y(mframe, vir_top);
        mpp_frame_set_ver_stride(mframe, vir_top + height + vir_bottom);
        regs->vdpu_av1d_pp_cfg.swreg322.sw_pp_out_format = 0;
        regs->vdpu_av1d_pp_cfg.swreg326.sw_pp_out_lu_base_lsb = mpp_buffer_get_fd(buffer);
        regs->vdpu_av1d_pp_cfg.swreg328.sw_pp_out_ch_base_lsb = mpp_buffer_get_fd(buffer);
        regs->vdpu_av1d_pp_cfg.swreg505.sw_pp0_afbc_tile_base_lsb = mpp_buffer_get_fd(buffer);
    } else {
        RK_U32 out_w = hor_stride;
        RK_U32 out_h = ver_stride;
        RK_U32 y_stride = out_w * out_h;
        RK_U32 out_fmt = 0;

        if ((mpp_frame_get_fmt(mframe) & MPP_FRAME_FMT_MASK) == MPP_FMT_YUV420SP)
            out_fmt = 3;

        /*
         * out_fmt:
         * 0 is 8bit or 10bit output by syntax
         * 3 is force 8bit output
         */
        regs->vdpu_av1d_pp_cfg.swreg322.sw_pp_out_format = out_fmt;
        regs->vdpu_av1d_pp_cfg.swreg326.sw_pp_out_lu_base_lsb = mpp_buffer_get_fd(buffer);
        regs->vdpu_av1d_pp_cfg.swreg328.sw_pp_out_ch_base_lsb = mpp_buffer_get_fd(buffer);
        mpp_dev_set_reg_offset(p_hal->dev, 328, y_stride);
    }

__RETURN:
    return ret = MPP_OK;
}